

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to8.h
# Opt level: O3

void ncnn::conv3x3s1_pack1to8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined1 auVar58 [12];
  undefined1 auVar59 [28];
  undefined1 auVar60 [28];
  undefined1 auVar61 [28];
  undefined1 (*pauVar62) [32];
  undefined1 (*pauVar63) [32];
  int iVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 (*pauVar69) [32];
  void *pvVar70;
  undefined1 (*pauVar71) [32];
  undefined1 (*pauVar72) [32];
  ulong uVar73;
  ulong uVar74;
  void *pvVar75;
  int iVar76;
  undefined1 (*pauVar77) [32];
  ulong uVar78;
  float *pfVar79;
  long lVar80;
  void *pvVar81;
  long lVar82;
  undefined1 (*pauVar83) [32];
  undefined1 (*pauVar84) [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 in_ZMM1 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar102;
  undefined1 auVar103 [32];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar115 [64];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar127 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar128 [64];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float in_register_0000159c;
  float fVar143;
  ulong local_338;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 *local_1b8;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 auVar129 [64];
  
  uVar5 = bottom_blob->c;
  uVar6 = top_blob->w;
  iVar7 = top_blob->h;
  iVar8 = top_blob->c;
  uVar74 = (long)iVar8 & 0xfffffffffffffffe;
  if (0 < iVar8 >> 1) {
    uVar73 = 0;
    do {
      uVar67 = (long)top_blob->h * (long)top_blob->w;
      uVar68 = top_blob->elemsize;
      lVar82 = top_blob->cstep * uVar68;
      if (top_blob->dims != 4) {
        uVar67 = (uVar67 * uVar68 + 0xf & 0xfffffffffffffff0) / uVar68;
      }
      uVar68 = uVar73 * 2;
      uVar78 = uVar68 | 1;
      if (_bias == (Mat *)0x0) {
        in_ZMM1 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar85 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        in_ZMM1 = ZEXT3264(*(undefined1 (*) [32])(&_bias->data + uVar73 * 8));
        auVar85 = *(undefined1 (*) [32])(&_bias->data + uVar78 * 4);
      }
      pauVar69 = (undefined1 (*) [32])(lVar82 * uVar68 + (long)top_blob->data);
      pauVar83 = (undefined1 (*) [32])(lVar82 * uVar78 + (long)top_blob->data);
      iVar76 = top_blob->d * (int)uVar67;
      pauVar71 = pauVar69;
      iVar64 = iVar76;
      if (0 < iVar76) {
        do {
          *pauVar71 = in_ZMM1._0_32_;
          iVar64 = iVar64 + -1;
          pauVar71 = pauVar71 + 1;
        } while (iVar64 != 0);
        pauVar71 = pauVar83;
        if (0 < iVar76) {
          do {
            *pauVar71 = auVar85;
            iVar76 = iVar76 + -1;
            pauVar71 = pauVar71 + 1;
          } while (iVar76 != 0);
        }
      }
      if (0 < (int)uVar5) {
        pfVar79 = (float *)(uVar78 * kernel->elemsize * kernel->cstep + (long)kernel->data);
        local_1b8 = (undefined8 *)(uVar68 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_338 = 0;
        do {
          if (0 < iVar7) {
            uVar42 = *local_1b8;
            uVar43 = local_1b8[1];
            uVar44 = local_1b8[2];
            uVar45 = local_1b8[3];
            uVar46 = local_1b8[4];
            uVar47 = local_1b8[5];
            uVar48 = local_1b8[6];
            uVar49 = local_1b8[7];
            uVar50 = *(undefined8 *)*(undefined1 (*) [12])(local_1b8 + 8);
            auVar58 = *(undefined1 (*) [12])(local_1b8 + 8);
            local_b8 = (float)uVar50;
            fStack_b4 = (float)((ulong)uVar50 >> 0x20);
            fStack_b0 = (float)local_1b8[9];
            fStack_ac = (float)((ulong)local_1b8[9] >> 0x20);
            fStack_a8 = (float)local_1b8[10];
            fStack_a4 = (float)((ulong)local_1b8[10] >> 0x20);
            fStack_a0 = (float)local_1b8[0xb];
            fStack_9c = (float)((ulong)local_1b8[0xb] >> 0x20);
            auVar85 = *(undefined1 (*) [32])(local_1b8 + 0xc);
            auVar3 = *(undefined1 (*) [32])(local_1b8 + 0x10);
            auVar4 = *(undefined1 (*) [32])(local_1b8 + 0x14);
            fVar90 = *(float *)(local_1b8 + 0x18);
            fVar105 = *(float *)((long)local_1b8 + 0xc4);
            fVar89 = *(float *)(local_1b8 + 0x19);
            fVar92 = *(float *)((long)local_1b8 + 0xcc);
            fVar9 = *(float *)(local_1b8 + 0x1a);
            fVar10 = *(float *)((long)local_1b8 + 0xd4);
            fVar11 = *(float *)(local_1b8 + 0x1b);
            fVar12 = *(float *)(local_1b8 + 0x1c);
            fVar13 = *(float *)((long)local_1b8 + 0xe4);
            fVar14 = *(float *)(local_1b8 + 0x1d);
            fVar15 = *(float *)((long)local_1b8 + 0xec);
            fVar16 = *(float *)(local_1b8 + 0x1e);
            fVar17 = *(float *)((long)local_1b8 + 0xf4);
            fVar18 = *(float *)(local_1b8 + 0x1f);
            fVar19 = *(float *)(local_1b8 + 0x20);
            fVar20 = *(float *)((long)local_1b8 + 0x104);
            fVar21 = *(float *)(local_1b8 + 0x21);
            fVar22 = *(float *)((long)local_1b8 + 0x10c);
            fVar23 = *(float *)(local_1b8 + 0x22);
            fVar24 = *(float *)((long)local_1b8 + 0x114);
            fVar25 = *(float *)(local_1b8 + 0x23);
            fVar112 = *(float *)((long)local_1b8 + 0x11c);
            fVar96 = *pfVar79;
            fVar35 = pfVar79[1];
            fVar119 = pfVar79[2];
            fVar36 = pfVar79[3];
            fVar121 = pfVar79[4];
            fVar37 = pfVar79[5];
            fVar38 = pfVar79[6];
            in_register_0000159c = pfVar79[7];
            fVar91 = pfVar79[8];
            fVar97 = pfVar79[9];
            fVar143 = pfVar79[10];
            fVar118 = pfVar79[0xb];
            fVar93 = pfVar79[0xc];
            fVar95 = pfVar79[0xd];
            fVar26 = pfVar79[0xe];
            fVar114 = pfVar79[0xf];
            auVar59 = *(undefined1 (*) [28])*(undefined1 (*) [32])(pfVar79 + 0x10);
            fVar34 = pfVar79[0x17];
            auVar88 = *(undefined1 (*) [32])(pfVar79 + 0x10);
            auVar86 = *(undefined1 (*) [32])(pfVar79 + 0x18);
            auVar115 = ZEXT3264(auVar86);
            fVar137 = *(float *)*(undefined1 (*) [28])(pfVar79 + 0x20);
            fVar39 = pfVar79[0x21];
            fVar94 = pfVar79[0x22];
            fVar40 = pfVar79[0x23];
            fVar101 = pfVar79[0x24];
            fVar41 = pfVar79[0x25];
            fVar104 = pfVar79[0x26];
            auVar60 = *(undefined1 (*) [28])(pfVar79 + 0x20);
            uVar50 = *(undefined8 *)(pfVar79 + 0x28);
            uVar51 = *(undefined8 *)(pfVar79 + 0x2a);
            uVar52 = *(undefined8 *)(pfVar79 + 0x2c);
            uVar53 = *(undefined8 *)(pfVar79 + 0x2e);
            auVar87 = *(undefined1 (*) [32])(pfVar79 + 0x30);
            auVar128 = ZEXT3264(auVar87);
            pvVar70 = (void *)(bottom_blob->cstep * local_338 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar82 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar75 = (void *)((long)pvVar70 + lVar82 * 2);
            pvVar81 = (void *)(lVar82 + (long)pvVar70);
            iVar64 = 0;
            uVar54 = *(undefined8 *)(pfVar79 + 0x38);
            uVar55 = *(undefined8 *)(pfVar79 + 0x3a);
            uVar56 = *(undefined8 *)(pfVar79 + 0x3c);
            uVar57 = *(undefined8 *)(pfVar79 + 0x3e);
            fVar27 = pfVar79[0x40];
            fVar28 = pfVar79[0x41];
            fVar29 = pfVar79[0x42];
            fVar30 = pfVar79[0x43];
            fVar31 = pfVar79[0x44];
            fVar32 = pfVar79[0x45];
            fVar33 = pfVar79[0x46];
            fVar141 = pfVar79[0x47];
            pauVar71 = pauVar83;
            pauVar77 = pauVar69;
            fVar139 = fVar34;
            do {
              local_2a8 = (float)uVar42;
              fStack_2a0 = (float)uVar43;
              fStack_298 = (float)uVar44;
              local_d8 = (float)uVar46;
              fStack_d4 = (float)((ulong)uVar46 >> 0x20);
              fStack_d0 = (float)uVar47;
              fStack_cc = (float)((ulong)uVar47 >> 0x20);
              fStack_c8 = (float)uVar48;
              fStack_c4 = (float)((ulong)uVar48 >> 0x20);
              fStack_c0 = (float)uVar49;
              local_248 = auVar85._0_4_;
              fStack_240 = auVar85._8_4_;
              fStack_23c = auVar85._12_4_;
              fStack_238 = auVar85._16_4_;
              fStack_234 = auVar85._20_4_;
              fStack_230 = auVar85._24_4_;
              local_228 = auVar3._0_4_;
              fStack_224 = auVar3._4_4_;
              fStack_220 = auVar3._8_4_;
              fStack_21c = auVar3._12_4_;
              fStack_218 = auVar3._16_4_;
              fStack_214 = auVar3._20_4_;
              fStack_210 = auVar3._24_4_;
              fStack_264 = auVar4._4_4_;
              fStack_260 = auVar4._8_4_;
              fStack_25c = auVar4._12_4_;
              fStack_258 = auVar4._16_4_;
              fStack_254 = auVar4._20_4_;
              fStack_250 = auVar4._24_4_;
              local_208 = auVar88._0_4_;
              fVar125 = local_208;
              fStack_204 = auVar88._4_4_;
              fStack_200 = auVar88._8_4_;
              fStack_1fc = auVar88._12_4_;
              fStack_1f8 = auVar88._16_4_;
              fStack_1f4 = auVar88._20_4_;
              fStack_1f0 = auVar88._24_4_;
              local_188 = auVar86._0_4_;
              fStack_184 = auVar86._4_4_;
              fStack_180 = auVar86._8_4_;
              fStack_17c = auVar86._12_4_;
              fStack_178 = auVar86._16_4_;
              fStack_174 = auVar86._20_4_;
              fStack_170 = auVar86._24_4_;
              local_328 = (float)uVar50;
              fStack_320 = (float)uVar51;
              fStack_318 = (float)uVar52;
              fStack_f4 = auVar87._4_4_;
              fStack_f0 = auVar87._8_4_;
              fStack_ec = auVar87._12_4_;
              fStack_e8 = auVar87._16_4_;
              fStack_e4 = auVar87._20_4_;
              fStack_e0 = auVar87._24_4_;
              local_2c8 = (float)uVar54;
              fStack_2c0 = (float)uVar55;
              fStack_2b8 = (float)uVar56;
              fStack_290 = (float)uVar45;
              fStack_310 = (float)uVar53;
              fStack_2b0 = (float)uVar57;
              fStack_2a4 = (float)((ulong)uVar42 >> 0x20);
              fStack_29c = (float)((ulong)uVar43 >> 0x20);
              fStack_294 = (float)((ulong)uVar44 >> 0x20);
              fStack_244 = auVar85._4_4_;
              fStack_324 = (float)((ulong)uVar50 >> 0x20);
              fStack_31c = (float)((ulong)uVar51 >> 0x20);
              fStack_314 = (float)((ulong)uVar52 >> 0x20);
              local_f8 = auVar87._0_4_;
              fStack_2c4 = (float)((ulong)uVar54 >> 0x20);
              fStack_2bc = (float)((ulong)uVar55 >> 0x20);
              fStack_2b4 = (float)((ulong)uVar56 >> 0x20);
              local_268 = auVar4._0_4_;
              if ((int)uVar6 < 4) {
                uVar66 = 0;
              }
              else {
                iVar76 = 3;
                lVar82 = 0;
                pauVar62 = pauVar77;
                pauVar63 = pauVar71;
                do {
                  pauVar84 = pauVar63;
                  pauVar72 = pauVar62;
                  fVar109 = *(float *)((long)pvVar70 + lVar82);
                  fVar110 = *(float *)((long)pvVar70 + lVar82 + 4);
                  fVar102 = *(float *)((long)pvVar70 + lVar82 + 8);
                  fVar107 = *(float *)((long)pvVar81 + lVar82);
                  fVar120 = *(float *)((long)pvVar81 + lVar82 + 4);
                  pfVar1 = (float *)((long)*pauVar77 + lVar82 * 2 * 4);
                  fVar106 = *(float *)((long)pvVar81 + lVar82 + 8);
                  fVar136 = *(float *)((long)pvVar75 + lVar82);
                  pfVar2 = (float *)((long)*pauVar71 + lVar82 * 2 * 4);
                  fVar138 = *(float *)((long)pvVar75 + lVar82 + 4);
                  fVar113 = fVar139 + fVar114 + pfVar1[7];
                  fVar133 = auVar128._28_4_ + fVar141 + fVar141 + fVar141 + fVar113;
                  local_208 = auVar59._0_4_;
                  fVar142 = fVar139 + fVar113;
                  fVar114 = *(float *)((long)pvVar75 + lVar82 + 8);
                  fVar141 = *pfVar2;
                  fVar108 = pfVar2[1];
                  fVar126 = pfVar2[2];
                  fVar130 = pfVar2[3];
                  fVar131 = pfVar2[4];
                  fVar132 = pfVar2[5];
                  fVar116 = pfVar2[6];
                  fVar111 = fVar142 + fVar109 + pfVar2[7];
                  fVar139 = fVar139 + fVar113 + fVar142;
                  fVar113 = fVar142 + fVar107 + fVar142 + fVar111;
                  fVar122 = fVar139 + fVar133;
                  fVar111 = fVar133 + fVar111 + fVar136 + fVar113;
                  *pfVar1 = fVar136 * fVar90 + fVar120 * local_228 + fVar109 * local_2a8 + *pfVar1 +
                            fVar114 * fVar19 +
                            fVar110 * local_d8 + fVar102 * local_b8 + fVar107 * local_248 +
                            fVar106 * local_268 + fVar138 * fVar12;
                  pfVar1[1] = fVar136 * fVar105 +
                              fVar120 * fStack_224 + fVar109 * fStack_2a4 + pfVar1[1] +
                              fVar114 * fVar20 +
                              fVar110 * fStack_d4 + fVar102 * fStack_b4 + fVar107 * fStack_244 +
                              fVar106 * fStack_264 + fVar138 * fVar13;
                  pfVar1[2] = fVar136 * fVar89 +
                              fVar120 * fStack_220 + fVar109 * fStack_2a0 + pfVar1[2] +
                              fVar114 * fVar21 +
                              fVar110 * fStack_d0 + fVar102 * fStack_b0 + fVar107 * fStack_240 +
                              fVar106 * fStack_260 + fVar138 * fVar14;
                  pfVar1[3] = fVar136 * fVar92 +
                              fVar120 * fStack_21c + fVar109 * fStack_29c + pfVar1[3] +
                              fVar114 * fVar22 +
                              fVar110 * fStack_cc + fVar102 * fStack_ac + fVar107 * fStack_23c +
                              fVar106 * fStack_25c + fVar138 * fVar15;
                  pfVar1[4] = fVar136 * fVar9 +
                              fVar120 * fStack_218 + fVar109 * fStack_298 + pfVar1[4] +
                              fVar114 * fVar23 +
                              fVar110 * fStack_c8 + fVar102 * fStack_a8 + fVar107 * fStack_238 +
                              fVar106 * fStack_258 + fVar138 * fVar16;
                  pfVar1[5] = fVar136 * fVar10 +
                              fVar120 * fStack_214 + fVar109 * fStack_294 + pfVar1[5] +
                              fVar114 * fVar24 +
                              fVar110 * fStack_c4 + fVar102 * fStack_a4 + fVar107 * fStack_234 +
                              fVar106 * fStack_254 + fVar138 * fVar17;
                  pfVar1[6] = fVar136 * fVar11 +
                              fVar120 * fStack_210 + fVar109 * fStack_290 + pfVar1[6] +
                              fVar114 * fVar25 +
                              fVar110 * fStack_c0 + fVar102 * fStack_a0 + fVar107 * fStack_230 +
                              fVar106 * fStack_250 + fVar138 * fVar18;
                  pfVar1[7] = fVar122;
                  *pfVar2 = fVar114 * fVar27 +
                            fVar120 * fVar137 + fVar109 * fVar96 + fVar141 + fVar136 * local_f8 +
                            fVar110 * fVar91 + fVar102 * local_208 + fVar107 * local_188 +
                            fVar106 * local_328 + fVar138 * local_2c8;
                  pfVar2[1] = fVar114 * fVar28 +
                              fVar120 * fVar39 + fVar109 * fVar35 + fVar108 + fVar136 * fStack_f4 +
                              fVar110 * fVar97 + fVar102 * fStack_204 + fVar107 * fStack_184 +
                              fVar106 * fStack_324 + fVar138 * fStack_2c4;
                  pfVar2[2] = fVar114 * fVar29 +
                              fVar120 * fVar94 + fVar109 * fVar119 + fVar126 + fVar136 * fStack_f0 +
                              fVar110 * fVar143 + fVar102 * fStack_200 + fVar107 * fStack_180 +
                              fVar106 * fStack_320 + fVar138 * fStack_2c0;
                  pfVar2[3] = fVar114 * fVar30 +
                              fVar120 * fVar40 + fVar109 * fVar36 + fVar130 + fVar136 * fStack_ec +
                              fVar110 * fVar118 + fVar102 * fStack_1fc + fVar107 * fStack_17c +
                              fVar106 * fStack_31c + fVar138 * fStack_2bc;
                  pfVar2[4] = fVar114 * fVar31 +
                              fVar120 * fVar101 + fVar109 * fVar121 + fVar131 + fVar136 * fStack_e8
                              + fVar110 * fVar93 + fVar102 * fStack_1f8 + fVar107 * fStack_178 +
                                fVar106 * fStack_318 + fVar138 * fStack_2b8;
                  pfVar2[5] = fVar114 * fVar32 +
                              fVar120 * fVar41 + fVar109 * fVar37 + fVar132 + fVar136 * fStack_e4 +
                              fVar110 * fVar95 + fVar102 * fStack_1f4 + fVar107 * fStack_174 +
                              fVar106 * fStack_314 + fVar138 * fStack_2b4;
                  pfVar2[6] = fVar114 * fVar33 +
                              fVar120 * fVar104 + fVar109 * fVar38 + fVar116 + fVar136 * fStack_e0 +
                              fVar110 * fVar26 + fVar102 * fStack_1f0 + fVar107 * fStack_170 +
                              fVar106 * fStack_310 + fVar138 * fStack_2b0;
                  pfVar2[7] = fVar111;
                  fVar122 = fVar122 + fVar113;
                  fVar109 = *(float *)((long)pvVar70 + lVar82 + 0xc);
                  fVar107 = *(float *)((long)pvVar81 + lVar82 + 0xc);
                  fVar139 = fVar139 + fVar110;
                  fVar136 = *(float *)((long)pvVar75 + lVar82 + 0xc);
                  fStack_16c = auVar86._28_4_;
                  fVar116 = fVar139 + fVar120 + fVar142;
                  fVar134 = fVar133 + fVar142 + fVar142 + fVar142;
                  fVar133 = fVar139 + fVar142 + fVar116;
                  fVar139 = pfVar2[8];
                  fVar141 = pfVar2[9];
                  fVar108 = pfVar2[10];
                  fVar126 = pfVar2[0xb];
                  fVar130 = pfVar2[0xc];
                  fVar131 = pfVar2[0xd];
                  fVar132 = pfVar2[0xe];
                  fVar111 = fVar113 + fVar111 + fVar122 + fVar122 + pfVar1[0xf] + fVar134;
                  fVar116 = fVar116 + fVar109 + fVar142 + pfVar2[0xf] + fVar133;
                  pfVar1[8] = fVar102 * local_d8 + fVar110 * local_2a8 +
                              local_228 * fVar106 + fVar120 * local_248 + fVar138 * fVar90 +
                              pfVar1[8] +
                              fVar12 * fVar114 + fVar109 * local_b8 + fVar107 * local_268 +
                              fVar136 * fVar19;
                  pfVar1[9] = fVar102 * fStack_d4 + fVar110 * fStack_2a4 +
                              fStack_224 * fVar106 + fVar120 * fStack_244 + fVar138 * fVar105 +
                              pfVar1[9] +
                              fVar13 * fVar114 + fVar109 * fStack_b4 + fVar107 * fStack_264 +
                              fVar136 * fVar20;
                  pfVar1[10] = fVar102 * fStack_d0 + fVar110 * fStack_2a0 +
                               fStack_220 * fVar106 + fVar120 * fStack_240 + fVar138 * fVar89 +
                               pfVar1[10] +
                               fVar14 * fVar114 + fVar109 * fStack_b0 + fVar107 * fStack_260 +
                               fVar136 * fVar21;
                  pfVar1[0xb] = fVar102 * fStack_cc + fVar110 * fStack_29c +
                                fStack_21c * fVar106 + fVar120 * fStack_23c + fVar138 * fVar92 +
                                pfVar1[0xb] +
                                fVar15 * fVar114 + fVar109 * fStack_ac + fVar107 * fStack_25c +
                                fVar136 * fVar22;
                  pfVar1[0xc] = fVar102 * fStack_c8 + fVar110 * fStack_298 +
                                fStack_218 * fVar106 + fVar120 * fStack_238 + fVar138 * fVar9 +
                                pfVar1[0xc] +
                                fVar16 * fVar114 + fVar109 * fStack_a8 + fVar107 * fStack_258 +
                                fVar136 * fVar23;
                  pfVar1[0xd] = fVar102 * fStack_c4 + fVar110 * fStack_294 +
                                fStack_214 * fVar106 + fVar120 * fStack_234 + fVar138 * fVar10 +
                                pfVar1[0xd] +
                                fVar17 * fVar114 + fVar109 * fStack_a4 + fVar107 * fStack_254 +
                                fVar136 * fVar24;
                  pfVar1[0xe] = fVar102 * fStack_c0 + fVar110 * fStack_290 +
                                fStack_210 * fVar106 + fVar120 * fStack_230 + fVar138 * fVar11 +
                                pfVar1[0xe] +
                                fVar18 * fVar114 + fVar109 * fStack_a0 + fVar107 * fStack_250 +
                                fVar136 * fVar25;
                  pfVar1[0xf] = fVar111;
                  pfVar2[8] = fVar102 * fVar91 + fVar110 * fVar96 +
                              fVar120 * local_188 + fVar106 * fVar137 +
                              fVar138 * local_f8 + fVar114 * local_2c8 + fVar139 +
                              fVar109 * local_208 + fVar107 * local_328 + fVar136 * fVar27;
                  pfVar2[9] = fVar102 * fVar97 + fVar110 * fVar35 +
                              fVar120 * fStack_184 + fVar106 * fVar39 +
                              fVar138 * fStack_f4 + fVar114 * fStack_2c4 + fVar141 +
                              fVar109 * fStack_204 + fVar107 * fStack_324 + fVar136 * fVar28;
                  pfVar2[10] = fVar102 * fVar143 + fVar110 * fVar119 +
                               fVar120 * fStack_180 + fVar106 * fVar94 +
                               fVar138 * fStack_f0 + fVar114 * fStack_2c0 + fVar108 +
                               fVar109 * fStack_200 + fVar107 * fStack_320 + fVar136 * fVar29;
                  pfVar2[0xb] = fVar102 * fVar118 + fVar110 * fVar36 +
                                fVar120 * fStack_17c + fVar106 * fVar40 +
                                fVar138 * fStack_ec + fVar114 * fStack_2bc + fVar126 +
                                fVar109 * fStack_1fc + fVar107 * fStack_31c + fVar136 * fVar30;
                  pfVar2[0xc] = fVar102 * fVar93 + fVar110 * fVar121 +
                                fVar120 * fStack_178 + fVar106 * fVar101 +
                                fVar138 * fStack_e8 + fVar114 * fStack_2b8 + fVar130 +
                                fVar109 * fStack_1f8 + fVar107 * fStack_318 + fVar136 * fVar31;
                  pfVar2[0xd] = fVar102 * fVar95 + fVar110 * fVar37 +
                                fVar120 * fStack_174 + fVar106 * fVar41 +
                                fVar138 * fStack_e4 + fVar114 * fStack_2b4 + fVar131 +
                                fVar109 * fStack_1f4 + fVar107 * fStack_314 + fVar136 * fVar32;
                  pfVar2[0xe] = fVar102 * fVar26 + fVar110 * fVar38 +
                                fVar120 * fStack_170 + fVar106 * fVar104 +
                                fVar138 * fStack_e0 + fVar114 * fStack_2b0 + fVar132 +
                                fVar109 * fStack_1f0 + fVar107 * fStack_310 + fVar136 * fVar33;
                  pfVar2[0xf] = fVar116;
                  fVar110 = *(float *)((long)pvVar70 + lVar82 + 0x10);
                  fVar120 = *(float *)((long)pvVar81 + lVar82 + 0x10);
                  fVar138 = *(float *)((long)pvVar75 + lVar82 + 0x10);
                  fVar140 = fVar102 + fVar109;
                  in_ZMM1 = ZEXT3264(auVar4);
                  fVar142 = fVar134 + fVar102 + fVar109 + fVar109;
                  fVar111 = fVar111 + fVar116 + fVar116 + fVar133 + fVar134 + pfVar1[0x17] + fVar142
                  ;
                  fVar139 = pfVar2[0x10];
                  fVar141 = pfVar2[0x11];
                  fVar108 = pfVar2[0x12];
                  fVar126 = pfVar2[0x13];
                  fVar130 = pfVar2[0x14];
                  fVar131 = pfVar2[0x15];
                  fVar132 = pfVar2[0x16];
                  fVar116 = pfVar2[0x17];
                  pfVar1[0x10] = fVar106 * local_248 + fVar102 * local_2a8 +
                                 fVar114 * fVar90 + fVar109 * local_d8 + fVar107 * local_228 +
                                 pfVar1[0x10] +
                                 fVar136 * fVar12 + fVar110 * local_b8 + fVar120 * local_268 +
                                 fVar138 * fVar19;
                  pfVar1[0x11] = fVar106 * fStack_244 + fVar102 * fStack_2a4 +
                                 fVar114 * fVar105 + fVar109 * fStack_d4 + fVar107 * fStack_224 +
                                 pfVar1[0x11] +
                                 fVar136 * fVar13 + fVar110 * fStack_b4 + fVar120 * fStack_264 +
                                 fVar138 * fVar20;
                  pfVar1[0x12] = fVar106 * fStack_240 + fVar102 * fStack_2a0 +
                                 fVar114 * fVar89 + fVar109 * fStack_d0 + fVar107 * fStack_220 +
                                 pfVar1[0x12] +
                                 fVar136 * fVar14 + fVar110 * fStack_b0 + fVar120 * fStack_260 +
                                 fVar138 * fVar21;
                  pfVar1[0x13] = fVar106 * fStack_23c + fVar102 * fStack_29c +
                                 fVar114 * fVar92 + fVar109 * fStack_cc + fVar107 * fStack_21c +
                                 pfVar1[0x13] +
                                 fVar136 * fVar15 + fVar110 * fStack_ac + fVar120 * fStack_25c +
                                 fVar138 * fVar22;
                  pfVar1[0x14] = fVar106 * fStack_238 + fVar102 * fStack_298 +
                                 fVar114 * fVar9 + fVar109 * fStack_c8 + fVar107 * fStack_218 +
                                 pfVar1[0x14] +
                                 fVar136 * fVar16 + fVar110 * fStack_a8 + fVar120 * fStack_258 +
                                 fVar138 * fVar23;
                  pfVar1[0x15] = fVar106 * fStack_234 + fVar102 * fStack_294 +
                                 fVar114 * fVar10 + fVar109 * fStack_c4 + fVar107 * fStack_214 +
                                 pfVar1[0x15] +
                                 fVar136 * fVar17 + fVar110 * fStack_a4 + fVar120 * fStack_254 +
                                 fVar138 * fVar24;
                  pfVar1[0x16] = fVar106 * fStack_230 + fVar102 * fStack_290 +
                                 fVar114 * fVar11 + fVar109 * fStack_c0 + fVar107 * fStack_210 +
                                 pfVar1[0x16] +
                                 fVar136 * fVar18 + fVar110 * fStack_a0 + fVar120 * fStack_250 +
                                 fVar138 * fVar25;
                  pfVar1[0x17] = fVar111;
                  pfVar2[0x10] = fVar107 * auVar60._0_4_ + fVar136 * local_2c8 +
                                 fVar102 * fVar96 + fVar106 * local_188 +
                                 fVar109 * fVar91 + fVar114 * local_f8 + fVar139 +
                                 fVar138 * fVar27 + fVar110 * local_208 + fVar120 * local_328;
                  pfVar2[0x11] = fVar107 * auVar60._4_4_ + fVar136 * fStack_2c4 +
                                 fVar102 * fVar35 + fVar106 * fStack_184 +
                                 fVar109 * fVar97 + fVar114 * fStack_f4 + fVar141 +
                                 fVar138 * fVar28 + fVar110 * fStack_204 + fVar120 * fStack_324;
                  pfVar2[0x12] = fVar107 * auVar60._8_4_ + fVar136 * fStack_2c0 +
                                 fVar102 * fVar119 + fVar106 * fStack_180 +
                                 fVar109 * fVar143 + fVar114 * fStack_f0 + fVar108 +
                                 fVar138 * fVar29 + fVar110 * fStack_200 + fVar120 * fStack_320;
                  pfVar2[0x13] = fVar107 * auVar60._12_4_ + fVar136 * fStack_2bc +
                                 fVar102 * fVar36 + fVar106 * fStack_17c +
                                 fVar109 * fVar118 + fVar114 * fStack_ec + fVar126 +
                                 fVar138 * fVar30 + fVar110 * fStack_1fc + fVar120 * fStack_31c;
                  pfVar2[0x14] = fVar107 * auVar60._16_4_ + fVar136 * fStack_2b8 +
                                 fVar102 * fVar121 + fVar106 * fStack_178 +
                                 fVar109 * fVar93 + fVar114 * fStack_e8 + fVar130 +
                                 fVar138 * fVar31 + fVar110 * fStack_1f8 + fVar120 * fStack_318;
                  pfVar2[0x15] = fVar107 * auVar60._20_4_ + fVar136 * fStack_2b4 +
                                 fVar102 * fVar37 + fVar106 * fStack_174 +
                                 fVar109 * fVar95 + fVar114 * fStack_e4 + fVar131 +
                                 fVar138 * fVar32 + fVar110 * fStack_1f4 + fVar120 * fStack_314;
                  pfVar2[0x16] = fVar107 * auVar60._24_4_ + fVar136 * fStack_2b0 +
                                 fVar102 * fVar38 + fVar106 * fStack_170 +
                                 fVar109 * fVar26 + fVar114 * fStack_e0 + fVar132 +
                                 fVar138 * fVar33 + fVar110 * fStack_1f0 + fVar120 * fStack_310;
                  pfVar2[0x17] = fVar140 + fVar102 + fStack_16c + fVar109 + fVar114 + fVar116 +
                                 fVar140 + fVar109 + fVar109 + fVar114;
                  fVar102 = *(float *)((long)pvVar70 + lVar82 + 0x14);
                  fVar114 = *(float *)((long)pvVar81 + lVar82 + 0x14);
                  fVar142 = fVar140 + fVar142;
                  fVar141 = fVar109 + fVar140;
                  fVar139 = *(float *)((long)pvVar75 + lVar82 + 0x14);
                  fVar126 = fVar102 * local_b8 + fVar114 * local_268 + fVar139 * fVar19;
                  fVar130 = fVar102 * fStack_b4 + fVar114 * fStack_264 + fVar139 * fVar20;
                  fVar131 = fVar102 * fStack_b0 + fVar114 * fStack_260 + fVar139 * fVar21;
                  fVar132 = fVar102 * fStack_ac + fVar114 * fStack_25c + fVar139 * fVar22;
                  fVar116 = fVar102 * fStack_a8 + fVar114 * fStack_258 + fVar139 * fVar23;
                  fVar113 = fVar102 * fStack_a4 + fVar114 * fStack_254 + fVar139 * fVar24;
                  fVar122 = fVar102 * fStack_a0 + fVar114 * fStack_250 + fVar139 * fVar25;
                  fVar133 = fVar140 + fVar142 + fVar141;
                  auVar128 = ZEXT3264(CONCAT428(fVar133,CONCAT424(fVar122,CONCAT420(fVar113,
                                                  CONCAT416(fVar116,CONCAT412(fVar132,CONCAT48(
                                                  fVar131,CONCAT44(fVar130,fVar126))))))));
                  fVar108 = fVar112 + fVar109;
                  fVar106 = fVar109 + fStack_9c + fVar108;
                  auVar98._0_4_ =
                       fVar107 * local_188 + fVar109 * fVar96 +
                       fVar136 * local_f8 + fVar110 * fVar91 +
                       fVar120 * auVar60._0_4_ + fVar138 * local_2c8 + fVar102 * fVar125 +
                       pfVar2[0x18] + fVar114 * local_328 + fVar139 * fVar27;
                  auVar98._4_4_ =
                       fVar107 * fStack_184 + fVar109 * fVar35 +
                       fVar136 * fStack_f4 + fVar110 * fVar97 +
                       fVar120 * auVar60._4_4_ + fVar138 * fStack_2c4 + fVar102 * fStack_204 +
                       pfVar2[0x19] + fVar114 * fStack_324 + fVar139 * fVar28;
                  auVar98._8_4_ =
                       fVar107 * fStack_180 + fVar109 * fVar119 +
                       fVar136 * fStack_f0 + fVar110 * fVar143 +
                       fVar120 * auVar60._8_4_ + fVar138 * fStack_2c0 + fVar102 * fStack_200 +
                       pfVar2[0x1a] + fVar114 * fStack_320 + fVar139 * fVar29;
                  auVar98._12_4_ =
                       fVar107 * fStack_17c + fVar109 * fVar36 +
                       fVar136 * fStack_ec + fVar110 * fVar118 +
                       fVar120 * auVar60._12_4_ + fVar138 * fStack_2bc + fVar102 * fStack_1fc +
                       pfVar2[0x1b] + fVar114 * fStack_31c + fVar139 * fVar30;
                  auVar98._16_4_ =
                       fVar107 * fStack_178 + fVar109 * fVar121 +
                       fVar136 * fStack_e8 + fVar110 * fVar93 +
                       fVar120 * auVar60._16_4_ + fVar138 * fStack_2b8 + fVar102 * fStack_1f8 +
                       pfVar2[0x1c] + fVar114 * fStack_318 + fVar139 * fVar31;
                  auVar98._20_4_ =
                       fVar107 * fStack_174 + fVar109 * fVar37 +
                       fVar136 * fStack_e4 + fVar110 * fVar95 +
                       fVar120 * auVar60._20_4_ + fVar138 * fStack_2b4 + fVar102 * fStack_1f4 +
                       pfVar2[0x1d] + fVar114 * fStack_314 + fVar139 * fVar32;
                  auVar98._24_4_ =
                       fVar107 * fStack_170 + fVar109 * fVar38 +
                       fVar136 * fStack_e0 + fVar110 * fVar26 +
                       fVar120 * auVar60._24_4_ + fVar138 * fStack_2b0 + fVar102 * fStack_1f0 +
                       pfVar2[0x1e] + fVar114 * fStack_310 + fVar139 * fVar33;
                  auVar98._28_4_ =
                       fVar106 + fVar108 + fVar138 + fVar102 + pfVar2[0x1f] + fVar102 + fVar106;
                  pfVar1[0x18] = fVar126 + fVar107 * local_248 + fVar109 * local_2a8 +
                                           fVar136 * fVar90 + fVar110 * local_d8 +
                                           fVar120 * local_228 + fVar138 * fVar12 + pfVar1[0x18];
                  pfVar1[0x19] = fVar130 + fVar107 * fStack_244 + fVar109 * fStack_2a4 +
                                           fVar136 * fVar105 + fVar110 * fStack_d4 +
                                           fVar120 * fStack_224 + fVar138 * fVar13 + pfVar1[0x19];
                  pfVar1[0x1a] = fVar131 + fVar107 * fStack_240 + fVar109 * fStack_2a0 +
                                           fVar136 * fVar89 + fVar110 * fStack_d0 +
                                           fVar120 * fStack_220 + fVar138 * fVar14 + pfVar1[0x1a];
                  pfVar1[0x1b] = fVar132 + fVar107 * fStack_23c + fVar109 * fStack_29c +
                                           fVar136 * fVar92 + fVar110 * fStack_cc +
                                           fVar120 * fStack_21c + fVar138 * fVar15 + pfVar1[0x1b];
                  pfVar1[0x1c] = fVar116 + fVar107 * fStack_238 + fVar109 * fStack_298 +
                                           fVar136 * fVar9 + fVar110 * fStack_c8 +
                                           fVar120 * fStack_218 + fVar138 * fVar16 + pfVar1[0x1c];
                  pfVar1[0x1d] = fVar113 + fVar107 * fStack_234 + fVar109 * fStack_294 +
                                           fVar136 * fVar10 + fVar110 * fStack_c4 +
                                           fVar120 * fStack_214 + fVar138 * fVar17 + pfVar1[0x1d];
                  pfVar1[0x1e] = fVar122 + fVar107 * fStack_230 + fVar109 * fStack_290 +
                                           fVar136 * fVar11 + fVar110 * fStack_c0 +
                                           fVar120 * fStack_210 + fVar138 * fVar18 + pfVar1[0x1e];
                  pfVar1[0x1f] = fVar133 + fVar140 + fVar111 + fVar142 + fVar141 + pfVar1[0x1f];
                  *(undefined1 (*) [32])(pfVar2 + 0x18) = auVar98;
                  lVar82 = lVar82 + 0x10;
                  iVar76 = iVar76 + 4;
                  pauVar62 = (undefined1 (*) [32])(pfVar1 + 0x20);
                  pauVar63 = (undefined1 (*) [32])(pfVar2 + 0x20);
                } while (iVar76 < (int)uVar6);
                pauVar77 = pauVar72 + 4;
                pauVar71 = pauVar84 + 4;
                pvVar70 = (void *)((long)pvVar70 + lVar82);
                pvVar81 = (void *)((long)pvVar81 + lVar82);
                pvVar75 = (void *)((long)pvVar75 + lVar82);
                auVar115 = ZEXT3264(auVar86);
                auVar128 = ZEXT3264(auVar87);
                uVar66 = uVar6 & 0xfffffffc;
              }
              if ((int)(uVar66 | 1) < (int)uVar6) {
                lVar82 = 0;
                pauVar63 = pauVar71;
                pauVar62 = pauVar77;
                uVar65 = uVar66;
                fVar109 = fVar141;
                do {
                  pauVar84 = pauVar62;
                  pauVar72 = pauVar63;
                  fVar110 = *(float *)((long)pvVar70 + lVar82);
                  fVar102 = *(float *)((long)pvVar70 + lVar82 + 4);
                  fVar114 = *(float *)((long)pvVar70 + lVar82 + 8);
                  fVar107 = *(float *)((long)pvVar81 + lVar82);
                  fVar120 = *(float *)((long)pvVar81 + lVar82 + 4);
                  fVar106 = *(float *)((long)pvVar81 + lVar82 + 8);
                  fVar136 = *(float *)((long)pvVar75 + lVar82);
                  fVar138 = *(float *)((long)pvVar75 + lVar82 + 4);
                  fVar141 = *(float *)((long)pvVar75 + lVar82 + 8);
                  fStack_28c = (float)((ulong)uVar45 >> 0x20);
                  pauVar62 = (undefined1 (*) [32])((long)pauVar77[2] + lVar82 * 2 * 4);
                  fVar108 = *(float *)((long)pauVar62[-2] + 4);
                  fVar126 = *(float *)((long)pauVar62[-2] + 8);
                  fVar130 = *(float *)((long)pauVar62[-2] + 0xc);
                  fVar131 = *(float *)((long)pauVar62[-2] + 0x10);
                  fVar132 = *(float *)((long)pauVar62[-2] + 0x14);
                  fVar116 = *(float *)((long)pauVar62[-2] + 0x18);
                  pauVar63 = (undefined1 (*) [32])((long)pauVar71[2] + lVar82 * 2 * 4);
                  fVar135 = auVar128._28_4_ + *(float *)((long)pauVar62[-2] + 0x1c) + fVar139 +
                            fVar139 + fVar139;
                  fVar111 = *(float *)pauVar63[-2];
                  fVar113 = *(float *)((long)pauVar63[-2] + 4);
                  fVar122 = *(float *)((long)pauVar63[-2] + 8);
                  fVar133 = *(float *)((long)pauVar63[-2] + 0xc);
                  fVar134 = *(float *)((long)pauVar63[-2] + 0x10);
                  fVar142 = *(float *)((long)pauVar63[-2] + 0x14);
                  fVar140 = *(float *)((long)pauVar63[-2] + 0x18);
                  in_ZMM1 = ZEXT3264(CONCAT428(fStack_9c,
                                               CONCAT424(fStack_a0,
                                                         CONCAT420(fStack_a4,
                                                                   CONCAT416(fStack_a8,
                                                                             CONCAT412(fStack_ac,
                                                                                       auVar58))))))
                  ;
                  fStack_28c = fVar139 + fStack_28c;
                  fVar123 = fVar110 + *(float *)((long)pauVar63[-2] + 0x1c) + fStack_28c;
                  fVar117 = fStack_28c + fVar107 + fStack_28c + fVar123;
                  fVar124 = fVar135 + fVar109 + fVar139 + fVar139 + fVar139 + fVar139;
                  fVar123 = fVar123 + fVar136 + fVar135 + fVar117;
                  *(float *)pauVar62[-2] =
                       fVar110 * local_2a8 + *(float *)pauVar62[-2] + fVar120 * local_228 +
                       fVar136 * fVar90 + fVar141 * fVar19 +
                       local_d8 * fVar102 + fVar114 * auVar58._0_4_ + fVar107 * local_248 +
                       fVar106 * local_268 + fVar138 * fVar12;
                  *(float *)((long)pauVar62[-2] + 4) =
                       fVar110 * fStack_2a4 + fVar108 + fVar120 * fStack_224 + fVar136 * fVar105 +
                       fVar141 * fVar20 +
                       fStack_d4 * fVar102 + fVar114 * auVar58._4_4_ + fVar107 * fStack_244 +
                       fVar106 * fStack_264 + fVar138 * fVar13;
                  *(float *)((long)pauVar62[-2] + 8) =
                       fVar110 * fStack_2a0 + fVar126 + fVar120 * fStack_220 + fVar136 * fVar89 +
                       fVar141 * fVar21 +
                       fStack_d0 * fVar102 + fVar114 * auVar58._8_4_ + fVar107 * fStack_240 +
                       fVar106 * fStack_260 + fVar138 * fVar14;
                  *(float *)((long)pauVar62[-2] + 0xc) =
                       fVar110 * fStack_29c + fVar130 + fVar120 * fStack_21c + fVar136 * fVar92 +
                       fVar141 * fVar22 +
                       fStack_cc * fVar102 + fVar114 * fStack_ac + fVar107 * fStack_23c +
                       fVar106 * fStack_25c + fVar138 * fVar15;
                  *(float *)((long)pauVar62[-2] + 0x10) =
                       fVar110 * fStack_298 + fVar131 + fVar120 * fStack_218 + fVar136 * fVar9 +
                       fVar141 * fVar23 +
                       fStack_c8 * fVar102 + fVar114 * fStack_a8 + fVar107 * fStack_238 +
                       fVar106 * fStack_258 + fVar138 * fVar16;
                  *(float *)((long)pauVar62[-2] + 0x14) =
                       fVar110 * fStack_294 + fVar132 + fVar120 * fStack_214 + fVar136 * fVar10 +
                       fVar141 * fVar24 +
                       fStack_c4 * fVar102 + fVar114 * fStack_a4 + fVar107 * fStack_234 +
                       fVar106 * fStack_254 + fVar138 * fVar17;
                  *(float *)((long)pauVar62[-2] + 0x18) =
                       fVar110 * fStack_290 + fVar116 + fVar120 * fStack_210 + fVar136 * fVar11 +
                       fVar141 * fVar25 +
                       fStack_c0 * fVar102 + fVar114 * fStack_a0 + fVar107 * fStack_230 +
                       fVar106 * fStack_250 + fVar138 * fVar18;
                  *(float *)((long)pauVar62[-2] + 0x1c) = fVar124;
                  *(float *)pauVar63[-2] =
                       fVar110 * fVar96 + fVar111 + fVar120 * fVar137 + fVar136 * local_f8 +
                       fVar141 * fVar27 +
                       fVar102 * fVar91 + fVar114 * fVar125 + fVar107 * local_188 +
                       fVar106 * local_328 + fVar138 * local_2c8;
                  *(float *)((long)pauVar63[-2] + 4) =
                       fVar110 * fVar35 + fVar113 + fVar120 * fVar39 + fVar136 * fStack_f4 +
                       fVar141 * fVar28 +
                       fVar102 * fVar97 + fVar114 * fStack_204 + fVar107 * fStack_184 +
                       fVar106 * fStack_324 + fVar138 * fStack_2c4;
                  *(float *)((long)pauVar63[-2] + 8) =
                       fVar110 * fVar119 + fVar122 + fVar120 * fVar94 + fVar136 * fStack_f0 +
                       fVar141 * fVar29 +
                       fVar102 * fVar143 + fVar114 * fStack_200 + fVar107 * fStack_180 +
                       fVar106 * fStack_320 + fVar138 * fStack_2c0;
                  *(float *)((long)pauVar63[-2] + 0xc) =
                       fVar110 * fVar36 + fVar133 + fVar120 * fVar40 + fVar136 * fStack_ec +
                       fVar141 * fVar30 +
                       fVar102 * fVar118 + fVar114 * fStack_1fc + fVar107 * fStack_17c +
                       fVar106 * fStack_31c + fVar138 * fStack_2bc;
                  *(float *)((long)pauVar63[-2] + 0x10) =
                       fVar110 * fVar121 + fVar134 + fVar120 * fVar101 + fVar136 * fStack_e8 +
                       fVar141 * fVar31 +
                       fVar102 * fVar93 + fVar114 * fStack_1f8 + fVar107 * fStack_178 +
                       fVar106 * fStack_318 + fVar138 * fStack_2b8;
                  *(float *)((long)pauVar63[-2] + 0x14) =
                       fVar110 * fVar37 + fVar142 + fVar120 * fVar41 + fVar136 * fStack_e4 +
                       fVar141 * fVar32 +
                       fVar102 * fVar95 + fVar114 * fStack_1f4 + fVar107 * fStack_174 +
                       fVar106 * fStack_314 + fVar138 * fStack_2b4;
                  *(float *)((long)pauVar63[-2] + 0x18) =
                       fVar110 * fVar38 + fVar140 + fVar120 * fVar104 + fVar136 * fStack_e0 +
                       fVar141 * fVar33 +
                       fVar102 * fVar26 + fVar114 * fStack_1f0 + fVar107 * fStack_170 +
                       fVar106 * fStack_310 + fVar138 * fStack_2b0;
                  *(float *)((long)pauVar63[-2] + 0x1c) = fVar123;
                  fVar139 = *(float *)((long)pvVar70 + lVar82 + 0xc);
                  fVar109 = *(float *)((long)pvVar81 + lVar82 + 0xc);
                  auVar128 = ZEXT3264(auVar87);
                  fVar110 = *(float *)((long)pvVar75 + lVar82 + 0xc);
                  fVar107 = fVar117 + fVar123 + fVar117 + fVar124 + fVar124 +
                            *(float *)((long)pauVar62[-1] + 0x1c);
                  auVar103._0_4_ =
                       local_d8 * fVar114 + local_2a8 * fVar102 +
                       fVar120 * local_248 + fVar106 * local_228 + fVar138 * fVar90 +
                       *(float *)pauVar62[-1] +
                       fVar141 * fVar12 + fVar139 * auVar58._0_4_ + fVar109 * local_268 +
                       fVar110 * fVar19;
                  auVar103._4_4_ =
                       fStack_d4 * fVar114 + fStack_2a4 * fVar102 +
                       fVar120 * fStack_244 + fVar106 * fStack_224 + fVar138 * fVar105 +
                       *(float *)((long)pauVar62[-1] + 4) +
                       fVar141 * fVar13 + fVar139 * auVar58._4_4_ + fVar109 * fStack_264 +
                       fVar110 * fVar20;
                  auVar103._8_4_ =
                       fStack_d0 * fVar114 + fStack_2a0 * fVar102 +
                       fVar120 * fStack_240 + fVar106 * fStack_220 + fVar138 * fVar89 +
                       *(float *)((long)pauVar62[-1] + 8) +
                       fVar141 * fVar14 + fVar139 * auVar58._8_4_ + fVar109 * fStack_260 +
                       fVar110 * fVar21;
                  auVar103._12_4_ =
                       fStack_cc * fVar114 + fStack_29c * fVar102 +
                       fVar120 * fStack_23c + fVar106 * fStack_21c + fVar138 * fVar92 +
                       *(float *)((long)pauVar62[-1] + 0xc) +
                       fVar141 * fVar15 + fVar139 * fStack_ac + fVar109 * fStack_25c +
                       fVar110 * fVar22;
                  auVar103._16_4_ =
                       fStack_c8 * fVar114 + fStack_298 * fVar102 +
                       fVar120 * fStack_238 + fVar106 * fStack_218 + fVar138 * fVar9 +
                       *(float *)((long)pauVar62[-1] + 0x10) +
                       fVar141 * fVar16 + fVar139 * fStack_a8 + fVar109 * fStack_258 +
                       fVar110 * fVar23;
                  auVar103._20_4_ =
                       fStack_c4 * fVar114 + fStack_294 * fVar102 +
                       fVar120 * fStack_234 + fVar106 * fStack_214 + fVar138 * fVar10 +
                       *(float *)((long)pauVar62[-1] + 0x14) +
                       fVar141 * fVar17 + fVar139 * fStack_a4 + fVar109 * fStack_254 +
                       fVar110 * fVar24;
                  auVar103._24_4_ =
                       fStack_c0 * fVar114 + fStack_290 * fVar102 +
                       fVar120 * fStack_230 + fVar106 * fStack_210 + fVar138 * fVar11 +
                       *(float *)((long)pauVar62[-1] + 0x18) +
                       fVar141 * fVar18 + fVar139 * fStack_a0 + fVar109 * fStack_250 +
                       fVar110 * fVar25;
                  auVar103._28_4_ = fVar107 + fVar124 + fVar141 + fVar141 + fVar141;
                  auVar99._0_4_ =
                       fVar114 * fVar91 + fVar102 * fVar96 + fVar120 * local_188 + fVar106 * fVar137
                       + local_f8 * fVar138 + fVar141 * local_2c8 + *(float *)pauVar63[-1] +
                       fVar139 * fVar125 + fVar109 * local_328 + fVar110 * fVar27;
                  auVar99._4_4_ =
                       fVar114 * fVar97 + fVar102 * fVar35 + fVar120 * fStack_184 + fVar106 * fVar39
                       + fStack_f4 * fVar138 + fVar141 * fStack_2c4 +
                       *(float *)((long)pauVar63[-1] + 4) +
                       fVar139 * fStack_204 + fVar109 * fStack_324 + fVar110 * fVar28;
                  auVar99._8_4_ =
                       fVar114 * fVar143 + fVar102 * fVar119 +
                       fVar120 * fStack_180 + fVar106 * fVar94 +
                       fStack_f0 * fVar138 + fVar141 * fStack_2c0 +
                       *(float *)((long)pauVar63[-1] + 8) +
                       fVar139 * fStack_200 + fVar109 * fStack_320 + fVar110 * fVar29;
                  auVar99._12_4_ =
                       fVar114 * fVar118 + fVar102 * fVar36 +
                       fVar120 * fStack_17c + fVar106 * fVar40 +
                       fStack_ec * fVar138 + fVar141 * fStack_2bc +
                       *(float *)((long)pauVar63[-1] + 0xc) +
                       fVar139 * fStack_1fc + fVar109 * fStack_31c + fVar110 * fVar30;
                  auVar99._16_4_ =
                       fVar114 * fVar93 + fVar102 * fVar121 +
                       fVar120 * fStack_178 + fVar106 * fVar101 +
                       fStack_e8 * fVar138 + fVar141 * fStack_2b8 +
                       *(float *)((long)pauVar63[-1] + 0x10) +
                       fVar139 * fStack_1f8 + fVar109 * fStack_318 + fVar110 * fVar31;
                  auVar99._20_4_ =
                       fVar114 * fVar95 + fVar102 * fVar37 + fVar120 * fStack_174 + fVar106 * fVar41
                       + fStack_e4 * fVar138 + fVar141 * fStack_2b4 +
                       *(float *)((long)pauVar63[-1] + 0x14) +
                       fVar139 * fStack_1f4 + fVar109 * fStack_314 + fVar110 * fVar32;
                  auVar99._24_4_ =
                       fVar114 * fVar26 + fVar102 * fVar38 +
                       fVar120 * fStack_170 + fVar106 * fVar104 +
                       fStack_e0 * fVar138 + fVar141 * fStack_2b0 +
                       *(float *)((long)pauVar63[-1] + 0x18) +
                       fVar139 * fStack_1f0 + fVar109 * fStack_310 + fVar110 * fVar33;
                  auVar99._28_4_ =
                       fVar114 + fVar102 + fVar120 + fVar106 + fVar138 + fVar141 +
                       *(float *)((long)pauVar63[-1] + 0x1c) + fVar106 + fVar114 + fVar102 + fVar107
                  ;
                  pauVar62[-1] = auVar103;
                  pauVar63[-1] = auVar99;
                  uVar66 = uVar65 + 2;
                  lVar82 = lVar82 + 8;
                  iVar76 = uVar65 + 3;
                  uVar65 = uVar66;
                  fVar109 = fVar141;
                  fVar139 = fVar34;
                } while (iVar76 < (int)uVar6);
                pauVar77 = pauVar84 + 2;
                pauVar71 = pauVar72 + 2;
                pvVar70 = (void *)((long)pvVar70 + lVar82);
                pvVar81 = (void *)((long)pvVar81 + lVar82);
                pvVar75 = (void *)((long)pvVar75 + lVar82);
                auVar115 = ZEXT3264(auVar86);
              }
              iVar76 = uVar6 - uVar66;
              if (iVar76 != 0 && (int)uVar66 <= (int)uVar6) {
                lVar82 = 0;
                lVar80 = 0;
                in_ZMM1 = ZEXT3264(auVar128._0_32_);
                auVar129 = auVar128;
                do {
                  fVar109 = *(float *)((long)pvVar70 + lVar82);
                  fVar110 = *(float *)((long)pvVar70 + lVar82 + 4);
                  fVar102 = *(float *)((long)pvVar70 + lVar82 + 8);
                  fVar107 = *(float *)((long)pvVar81 + lVar82);
                  fVar120 = *(float *)((long)pvVar81 + lVar82 + 4);
                  fVar106 = *(float *)((long)pvVar81 + lVar82 + 8);
                  fVar136 = *(float *)((long)pvVar75 + lVar82);
                  fVar138 = *(float *)((long)pvVar75 + lVar82 + 4);
                  fVar108 = *(float *)((long)pvVar75 + lVar82 + 8);
                  pfVar1 = (float *)((long)*pauVar77 + lVar82 * 2 * 4);
                  fVar141 = fVar141 + fVar139 + fVar139 + fVar139 + fVar139;
                  auVar127._0_4_ =
                       fVar109 * local_2a8 + *pfVar1 + fVar120 * local_228 + fVar136 * fVar90 +
                       fVar108 * fVar19 +
                       fVar110 * local_d8 + fVar102 * local_b8 + fVar107 * local_248 +
                       fVar106 * local_268 + fVar138 * fVar12;
                  auVar127._4_4_ =
                       fVar109 * fStack_2a4 + pfVar1[1] + fVar120 * fStack_224 + fVar136 * fVar105 +
                       fVar108 * fVar20 +
                       fVar110 * fStack_d4 + fVar102 * fStack_b4 + fVar107 * fStack_244 +
                       fVar106 * fStack_264 + fVar138 * fVar13;
                  auVar127._8_4_ =
                       fVar109 * fStack_2a0 + pfVar1[2] + fVar120 * fStack_220 + fVar136 * fVar89 +
                       fVar108 * fVar21 +
                       fVar110 * fStack_d0 + fVar102 * fStack_b0 + fVar107 * fStack_240 +
                       fVar106 * fStack_260 + fVar138 * fVar14;
                  auVar127._12_4_ =
                       fVar109 * fStack_29c + pfVar1[3] + fVar120 * fStack_21c + fVar136 * fVar92 +
                       fVar108 * fVar22 +
                       fVar110 * fStack_cc + fVar102 * fStack_ac + fVar107 * fStack_23c +
                       fVar106 * fStack_25c + fVar138 * fVar15;
                  auVar127._16_4_ =
                       fVar109 * fStack_298 + pfVar1[4] + fVar120 * fStack_218 + fVar136 * fVar9 +
                       fVar108 * fVar23 +
                       fVar110 * fStack_c8 + fVar102 * fStack_a8 + fVar107 * fStack_238 +
                       fVar106 * fStack_258 + fVar138 * fVar16;
                  auVar127._20_4_ =
                       fVar109 * fStack_294 + pfVar1[5] + fVar120 * fStack_214 + fVar136 * fVar10 +
                       fVar108 * fVar24 +
                       fVar110 * fStack_c4 + fVar102 * fStack_a4 + fVar107 * fStack_234 +
                       fVar106 * fStack_254 + fVar138 * fVar17;
                  auVar127._24_4_ =
                       fVar109 * fStack_290 + pfVar1[6] + fVar120 * fStack_210 + fVar136 * fVar11 +
                       fVar108 * fVar25 +
                       fVar110 * fStack_c0 + fVar102 * fStack_a0 + fVar107 * fStack_230 +
                       fVar106 * fStack_250 + fVar138 * fVar18;
                  auVar127._28_4_ =
                       auVar129._28_4_ + pfVar1[7] + fVar139 + fVar139 + fVar139 + fVar141;
                  auVar129 = ZEXT3264(auVar127);
                  fVar114 = fVar102 + fVar102 + fVar110;
                  pfVar1 = (float *)((long)*pauVar71 + lVar82 * 2 * 4);
                  auVar100._0_4_ =
                       fVar120 * fVar137 + fVar96 * fVar109 + *pfVar1 + fVar136 * auVar128._0_4_ +
                       fVar108 * fVar27 +
                       fVar107 * auVar115._0_4_ + fVar102 * fVar125 + fVar110 * fVar91 +
                       fVar106 * local_328 + fVar138 * local_2c8;
                  auVar100._4_4_ =
                       fVar120 * fVar39 + fVar35 * fVar109 + pfVar1[1] + fVar136 * auVar128._4_4_ +
                       fVar108 * fVar28 +
                       fVar107 * auVar115._4_4_ + fVar102 * fStack_204 + fVar110 * fVar97 +
                       fVar106 * fStack_324 + fVar138 * fStack_2c4;
                  auVar100._8_4_ =
                       fVar120 * fVar94 + fVar119 * fVar109 + pfVar1[2] + fVar136 * auVar128._8_4_ +
                       fVar108 * fVar29 +
                       fVar107 * auVar115._8_4_ + fVar102 * fStack_200 + fVar110 * fVar143 +
                       fVar106 * fStack_320 + fVar138 * fStack_2c0;
                  auVar100._12_4_ =
                       fVar120 * fVar40 + fVar36 * fVar109 + pfVar1[3] + fVar136 * auVar128._12_4_ +
                       fVar108 * fVar30 +
                       fVar107 * auVar115._12_4_ + fVar102 * fStack_1fc + fVar110 * fVar118 +
                       fVar106 * fStack_31c + fVar138 * fStack_2bc;
                  auVar100._16_4_ =
                       fVar120 * fVar101 + fVar121 * fVar109 + pfVar1[4] + fVar136 * auVar128._16_4_
                       + fVar108 * fVar31 +
                       fVar107 * auVar115._16_4_ + fVar102 * fStack_1f8 + fVar110 * fVar93 +
                       fVar106 * fStack_318 + fVar138 * fStack_2b8;
                  auVar100._20_4_ =
                       fVar120 * fVar41 + fVar37 * fVar109 + pfVar1[5] + fVar136 * auVar128._20_4_ +
                       fVar108 * fVar32 +
                       fVar107 * auVar115._20_4_ + fVar102 * fStack_1f4 + fVar110 * fVar95 +
                       fVar106 * fStack_314 + fVar138 * fStack_2b4;
                  auVar100._24_4_ =
                       fVar120 * fVar104 + fVar38 * fVar109 + pfVar1[6] + fVar136 * auVar128._24_4_
                       + fVar108 * fVar33 +
                       fVar107 * auVar115._24_4_ + fVar102 * fStack_1f0 + fVar110 * fVar26 +
                       fVar106 * fStack_310 + fVar138 * fStack_2b0;
                  auVar100._28_4_ =
                       fVar102 + fVar109 + pfVar1[7] + fVar136 + fVar108 +
                       fVar114 + fVar106 + fVar138;
                  *(undefined1 (*) [32])((long)*pauVar77 + lVar82 * 2 * 4) = auVar127;
                  *(undefined1 (*) [32])((long)*pauVar71 + lVar82 * 2 * 4) = auVar100;
                  lVar80 = lVar80 + -0x20;
                  lVar82 = lVar82 + 4;
                  iVar76 = iVar76 + -1;
                  fVar139 = fVar34;
                } while (iVar76 != 0);
                pauVar77 = (undefined1 (*) [32])((long)pauVar77 - lVar80);
                pauVar71 = (undefined1 (*) [32])((long)pauVar71 - lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar82);
                pvVar81 = (void *)((long)pvVar81 + lVar82);
                pvVar75 = (void *)((long)pvVar75 + lVar82);
                auVar115 = ZEXT3264(auVar115._0_32_);
                auVar128 = ZEXT3264(auVar128._0_32_);
              }
              pvVar70 = (void *)((long)pvVar70 + 8);
              pvVar81 = (void *)((long)pvVar81 + 8);
              pvVar75 = (void *)((long)pvVar75 + 8);
              iVar64 = iVar64 + 1;
            } while (iVar64 != iVar7);
          }
          local_1b8 = local_1b8 + 0x24;
          pfVar79 = pfVar79 + 0x48;
          local_338 = local_338 + 1;
        } while (local_338 != uVar5);
      }
      uVar73 = uVar73 + 1;
    } while (uVar73 != (uint)(iVar8 >> 1));
  }
  if ((int)uVar74 != iVar8) {
    do {
      uVar67 = (long)top_blob->h * (long)top_blob->w;
      uVar73 = top_blob->elemsize;
      uVar68 = (uVar73 * uVar67 + 0xf & 0xfffffffffffffff0) / uVar73;
      if (top_blob->dims == 4) {
        uVar68 = uVar67;
      }
      if (_bias == (Mat *)0x0) {
        auVar85 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar85 = *(undefined1 (*) [32])(&_bias->data + uVar74 * 4);
      }
      pauVar69 = (undefined1 (*) [32])(top_blob->cstep * uVar74 * uVar73 + (long)top_blob->data);
      iVar64 = (int)uVar68 * top_blob->d;
      pauVar71 = pauVar69;
      if (0 < iVar64) {
        do {
          *pauVar71 = auVar85;
          iVar64 = iVar64 + -1;
          pauVar71 = pauVar71 + 1;
        } while (iVar64 != 0);
      }
      if (0 < (int)uVar5) {
        pfVar79 = (float *)(kernel->cstep * uVar74 * kernel->elemsize + (long)kernel->data);
        uVar73 = 0;
        do {
          if (0 < iVar7) {
            fVar34 = *pfVar79;
            fVar96 = pfVar79[1];
            uVar49 = *(undefined8 *)pfVar79;
            fVar35 = pfVar79[2];
            fVar119 = pfVar79[3];
            uVar50 = *(undefined8 *)(pfVar79 + 2);
            fVar36 = pfVar79[4];
            fVar121 = pfVar79[5];
            uVar51 = *(undefined8 *)(pfVar79 + 4);
            fVar37 = pfVar79[6];
            uVar52 = *(undefined8 *)(pfVar79 + 6);
            fVar10 = pfVar79[8];
            fVar11 = pfVar79[9];
            fVar12 = pfVar79[10];
            fVar13 = pfVar79[0xb];
            fVar14 = pfVar79[0xc];
            fVar15 = pfVar79[0xd];
            fVar16 = pfVar79[0xe];
            fVar17 = pfVar79[0xf];
            local_228 = *(float *)*(undefined1 (*) [28])(pfVar79 + 0x10);
            fStack_224 = pfVar79[0x11];
            fStack_220 = pfVar79[0x12];
            fStack_21c = pfVar79[0x13];
            fStack_218 = pfVar79[0x14];
            fStack_214 = pfVar79[0x15];
            fStack_210 = pfVar79[0x16];
            auVar60 = *(undefined1 (*) [28])(pfVar79 + 0x10);
            pauVar71 = (undefined1 (*) [32])(pfVar79 + 0x18);
            fVar114 = *(float *)*pauVar71;
            fVar139 = pfVar79[0x19];
            fVar141 = pfVar79[0x1a];
            fVar90 = pfVar79[0x1b];
            fVar105 = pfVar79[0x1c];
            fVar89 = pfVar79[0x1d];
            fVar92 = pfVar79[0x1e];
            auVar59 = *(undefined1 (*) [28])*pauVar71;
            fVar9 = pfVar79[0x1f];
            auVar3 = *pauVar71;
            fVar18 = pfVar79[0x20];
            fVar19 = pfVar79[0x21];
            uVar42 = *(undefined8 *)(pfVar79 + 0x20);
            fVar20 = pfVar79[0x22];
            fVar21 = pfVar79[0x23];
            uVar43 = *(undefined8 *)(pfVar79 + 0x22);
            fVar22 = pfVar79[0x24];
            fVar23 = pfVar79[0x25];
            uVar44 = *(undefined8 *)(pfVar79 + 0x24);
            fVar24 = pfVar79[0x26];
            fVar25 = pfVar79[0x27];
            uVar45 = *(undefined8 *)(pfVar79 + 0x26);
            auVar85 = *(undefined1 (*) [32])(pfVar79 + 0x28);
            auVar115 = ZEXT3264(auVar85);
            pauVar71 = (undefined1 (*) [32])(pfVar79 + 0x30);
            fVar112 = *(float *)*pauVar71;
            fVar91 = pfVar79[0x31];
            fVar97 = pfVar79[0x32];
            fVar143 = pfVar79[0x33];
            fVar118 = pfVar79[0x34];
            fVar93 = pfVar79[0x35];
            fVar95 = pfVar79[0x36];
            auVar61 = *(undefined1 (*) [28])*pauVar71;
            fVar26 = pfVar79[0x37];
            auVar4 = *pauVar71;
            fVar27 = pfVar79[0x38];
            fVar28 = pfVar79[0x39];
            fVar29 = pfVar79[0x3a];
            fVar30 = pfVar79[0x3b];
            fVar31 = pfVar79[0x3c];
            fVar32 = pfVar79[0x3d];
            fVar33 = pfVar79[0x3e];
            fVar38 = pfVar79[0x40];
            fVar137 = pfVar79[0x41];
            uVar46 = *(undefined8 *)(pfVar79 + 0x40);
            fVar39 = pfVar79[0x42];
            fVar94 = pfVar79[0x43];
            uVar47 = *(undefined8 *)(pfVar79 + 0x42);
            fVar40 = pfVar79[0x44];
            fVar101 = pfVar79[0x45];
            uVar48 = *(undefined8 *)(pfVar79 + 0x44);
            fVar41 = pfVar79[0x46];
            pvVar70 = (void *)(bottom_blob->cstep * uVar73 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar82 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar75 = (void *)((long)pvVar70 + lVar82 * 2);
            pvVar81 = (void *)(lVar82 + (long)pvVar70);
            iVar64 = 0;
            pauVar71 = pauVar69;
            fVar104 = fVar18;
            fVar125 = fVar20;
            fVar109 = fVar22;
            fVar110 = fVar24;
            fVar102 = fVar34;
            fVar107 = fVar35;
            fVar120 = fVar36;
            fVar106 = fVar37;
            fVar136 = fVar38;
            fVar138 = fVar39;
            fVar108 = fVar40;
            do {
              local_2a8 = (float)uVar49;
              fStack_2a4 = (float)((ulong)uVar49 >> 0x20);
              fStack_2a0 = (float)uVar50;
              fStack_29c = (float)((ulong)uVar50 >> 0x20);
              fStack_298 = (float)uVar51;
              fStack_294 = (float)((ulong)uVar51 >> 0x20);
              fStack_290 = (float)uVar52;
              fStack_28c = (float)((ulong)uVar52 >> 0x20);
              local_328 = (float)uVar42;
              fStack_320 = (float)uVar43;
              fStack_318 = (float)uVar44;
              fStack_244 = auVar4._4_4_;
              fStack_240 = auVar4._8_4_;
              fStack_23c = auVar4._12_4_;
              fStack_238 = auVar4._16_4_;
              fStack_234 = auVar4._20_4_;
              fStack_230 = auVar4._24_4_;
              local_2c8 = (float)uVar46;
              fStack_2c4 = (float)((ulong)uVar46 >> 0x20);
              fStack_2c0 = (float)uVar47;
              fStack_2bc = (float)((ulong)uVar47 >> 0x20);
              fStack_2b8 = (float)uVar48;
              fStack_2b4 = (float)((ulong)uVar48 >> 0x20);
              fStack_310 = (float)uVar45;
              local_268 = auVar3._0_4_;
              fStack_264 = auVar3._4_4_;
              fStack_260 = auVar3._8_4_;
              fStack_25c = auVar3._12_4_;
              fStack_258 = auVar3._16_4_;
              fStack_254 = auVar3._20_4_;
              fStack_250 = auVar3._24_4_;
              local_248 = auVar61._0_4_;
              if ((int)uVar6 < 4) {
                uVar66 = 0;
                pauVar83 = pauVar71;
              }
              else {
                iVar76 = 3;
                lVar82 = 0;
                pauVar83 = pauVar71;
                do {
                  pauVar77 = pauVar83;
                  fVar114 = *(float *)((long)pvVar70 + lVar82);
                  fVar139 = *(float *)((long)pvVar70 + lVar82 + 4);
                  fVar141 = *(float *)((long)pvVar70 + lVar82 + 8);
                  fVar90 = *(float *)((long)pvVar81 + lVar82);
                  fVar105 = *(float *)((long)pvVar81 + lVar82 + 4);
                  fVar89 = *(float *)((long)pvVar81 + lVar82 + 8);
                  fVar92 = *(float *)((long)pvVar75 + lVar82);
                  fVar112 = *(float *)((long)pvVar75 + lVar82 + 4);
                  fVar91 = *(float *)((long)pvVar75 + lVar82 + 8);
                  pfVar1 = (float *)((long)*pauVar71 + lVar82 * 2 * 4);
                  fVar118 = fVar114 + pfVar1[7];
                  local_228 = auVar60._0_4_;
                  fStack_224 = auVar60._4_4_;
                  fStack_220 = auVar60._8_4_;
                  fStack_21c = auVar60._12_4_;
                  fStack_218 = auVar60._16_4_;
                  fStack_214 = auVar60._20_4_;
                  fStack_210 = auVar60._24_4_;
                  fVar93 = auVar59._0_4_;
                  fVar95 = auVar59._4_4_;
                  fVar96 = auVar59._8_4_;
                  fVar119 = auVar59._12_4_;
                  fVar121 = auVar59._16_4_;
                  fVar137 = auVar59._20_4_;
                  fVar94 = auVar59._24_4_;
                  local_208 = auVar85._0_4_;
                  fStack_204 = auVar85._4_4_;
                  fStack_200 = auVar85._8_4_;
                  fStack_1fc = auVar85._12_4_;
                  fStack_1f8 = auVar85._16_4_;
                  fStack_1f4 = auVar85._20_4_;
                  fStack_1f0 = auVar85._24_4_;
                  fVar104 = fVar118 + fVar118 + fVar118 + fVar17;
                  fVar97 = *(float *)((long)pvVar70 + lVar82 + 0xc);
                  fVar143 = *(float *)((long)pvVar81 + lVar82 + 0xc);
                  fVar101 = fVar104 + fVar118 + fVar118 + fStack_28c + fVar17 + fVar17;
                  fVar118 = *(float *)((long)pvVar75 + lVar82 + 0xc);
                  *pfVar1 = fVar91 * fVar38 +
                            local_248 * fVar92 + fVar114 * fVar34 + *pfVar1 + fVar105 * fVar18 +
                            fVar112 * fVar27 +
                            fVar89 * local_208 +
                            fVar139 * fVar10 + fVar141 * local_228 + fVar90 * fVar93;
                  pfVar1[1] = fVar91 * fStack_2c4 +
                              fStack_244 * fVar92 +
                              fVar114 * fStack_2a4 + pfVar1[1] + fVar105 * fVar19 +
                              fVar112 * fVar28 +
                              fVar89 * fStack_204 +
                              fVar139 * fVar11 + fVar141 * fStack_224 + fVar90 * fVar95;
                  pfVar1[2] = fVar91 * fVar39 +
                              fStack_240 * fVar92 + fVar114 * fVar35 + pfVar1[2] + fVar105 * fVar20
                              + fVar112 * fVar29 +
                                fVar89 * fStack_200 +
                                fVar139 * fVar12 + fVar141 * fStack_220 + fVar90 * fVar96;
                  pfVar1[3] = fVar91 * fStack_2bc +
                              fStack_23c * fVar92 +
                              fVar114 * fStack_29c + pfVar1[3] + fVar105 * fVar21 +
                              fVar112 * fVar30 +
                              fVar89 * fStack_1fc +
                              fVar139 * fVar13 + fVar141 * fStack_21c + fVar90 * fVar119;
                  pfVar1[4] = fVar91 * fVar40 +
                              fStack_238 * fVar92 + fVar114 * fVar36 + pfVar1[4] + fVar105 * fVar22
                              + fVar112 * fVar31 +
                                fVar89 * fStack_1f8 +
                                fVar139 * fVar14 + fVar141 * fStack_218 + fVar90 * fVar121;
                  pfVar1[5] = fVar91 * fStack_2b4 +
                              fStack_234 * fVar92 +
                              fVar114 * fStack_294 + pfVar1[5] + fVar105 * fVar23 +
                              fVar112 * fVar32 +
                              fVar89 * fStack_1f4 +
                              fVar139 * fVar15 + fVar141 * fStack_214 + fVar90 * fVar137;
                  pfVar1[6] = fVar91 * fVar41 +
                              fStack_230 * fVar92 + fVar114 * fVar37 + pfVar1[6] + fVar105 * fVar24
                              + fVar112 * fVar33 +
                                fVar89 * fStack_1f0 +
                                fVar139 * fVar16 + fVar141 * fStack_210 + fVar90 * fVar94;
                  pfVar1[7] = fVar101;
                  fVar104 = fVar104 + fVar101;
                  fVar125 = fVar104 + fVar139 + fVar105;
                  fStack_1ec = auVar85._28_4_;
                  fVar101 = pfVar1[0xf];
                  fVar114 = *(float *)((long)pvVar70 + lVar82 + 0x10);
                  fVar90 = *(float *)((long)pvVar81 + lVar82 + 0x10);
                  fVar92 = *(float *)((long)pvVar75 + lVar82 + 0x10);
                  fVar104 = fVar125 + fVar101 + fVar139 + fVar143 + fVar9 + fVar104 + fVar104;
                  pfVar1[8] = fVar141 * fVar10 + fVar139 * fVar34 +
                              fVar89 * fVar18 + fVar93 * fVar105 + pfVar1[8] +
                              fVar91 * fVar27 + local_248 * fVar112 + fVar97 * local_228 +
                              fVar143 * local_208 + fVar118 * fVar38;
                  pfVar1[9] = fVar141 * fVar11 + fVar139 * fStack_2a4 +
                              fVar89 * fVar19 + fVar95 * fVar105 + pfVar1[9] +
                              fVar91 * fVar28 + fStack_244 * fVar112 + fVar97 * fStack_224 +
                              fVar143 * fStack_204 + fVar118 * fStack_2c4;
                  pfVar1[10] = fVar141 * fVar12 + fVar139 * fVar35 +
                               fVar89 * fVar20 + fVar96 * fVar105 + pfVar1[10] +
                               fVar91 * fVar29 + fStack_240 * fVar112 + fVar97 * fStack_220 +
                               fVar143 * fStack_200 + fVar118 * fVar39;
                  pfVar1[0xb] = fVar141 * fVar13 + fVar139 * fStack_29c +
                                fVar89 * fVar21 + fVar119 * fVar105 + pfVar1[0xb] +
                                fVar91 * fVar30 + fStack_23c * fVar112 + fVar97 * fStack_21c +
                                fVar143 * fStack_1fc + fVar118 * fStack_2bc;
                  pfVar1[0xc] = fVar141 * fVar14 + fVar139 * fVar36 +
                                fVar89 * fVar22 + fVar121 * fVar105 + pfVar1[0xc] +
                                fVar91 * fVar31 + fStack_238 * fVar112 + fVar97 * fStack_218 +
                                fVar143 * fStack_1f8 + fVar118 * fVar40;
                  pfVar1[0xd] = fVar141 * fVar15 + fVar139 * fStack_294 +
                                fVar89 * fVar23 + fVar137 * fVar105 + pfVar1[0xd] +
                                fVar91 * fVar32 + fStack_234 * fVar112 + fVar97 * fStack_214 +
                                fVar143 * fStack_1f4 + fVar118 * fStack_2b4;
                  pfVar1[0xe] = fVar141 * fVar16 + fVar139 * fVar37 +
                                fVar89 * fVar24 + fVar94 * fVar105 + pfVar1[0xe] +
                                fVar91 * fVar33 + fStack_230 * fVar112 + fVar97 * fStack_210 +
                                fVar143 * fStack_1f0 + fVar118 * fVar41;
                  pfVar1[0xf] = fVar104;
                  fVar139 = *(float *)((long)pvVar70 + lVar82 + 0x14);
                  fVar105 = *(float *)((long)pvVar81 + lVar82 + 0x14);
                  fVar101 = fVar141 + fVar104 + fVar125 + fVar125 + fVar101 + pfVar1[0x17] +
                            fVar125 + fVar125 + fVar141 + fVar125 + fVar25;
                  fVar112 = *(float *)((long)pvVar75 + lVar82 + 0x14);
                  pfVar1[0x10] = fVar93 * fVar89 + fVar141 * fVar34 +
                                 local_248 * fVar91 + fVar97 * fVar10 + pfVar1[0x10] +
                                 fVar92 * fVar38 +
                                 fVar90 * local_208 +
                                 fVar114 * local_228 + fVar143 * fVar18 + fVar118 * fVar27;
                  pfVar1[0x11] = fVar95 * fVar89 + fVar141 * fStack_2a4 +
                                 fStack_244 * fVar91 + fVar97 * fVar11 + pfVar1[0x11] +
                                 fVar92 * fStack_2c4 +
                                 fVar90 * fStack_204 +
                                 fVar114 * fStack_224 + fVar143 * fVar19 + fVar118 * fVar28;
                  pfVar1[0x12] = fVar96 * fVar89 + fVar141 * fVar35 +
                                 fStack_240 * fVar91 + fVar97 * fVar12 + pfVar1[0x12] +
                                 fVar92 * fVar39 +
                                 fVar90 * fStack_200 +
                                 fVar114 * fStack_220 + fVar143 * fVar20 + fVar118 * fVar29;
                  pfVar1[0x13] = fVar119 * fVar89 + fVar141 * fStack_29c +
                                 fStack_23c * fVar91 + fVar97 * fVar13 + pfVar1[0x13] +
                                 fVar92 * fStack_2bc +
                                 fVar90 * fStack_1fc +
                                 fVar114 * fStack_21c + fVar143 * fVar21 + fVar118 * fVar30;
                  pfVar1[0x14] = fVar121 * fVar89 + fVar141 * fVar36 +
                                 fStack_238 * fVar91 + fVar97 * fVar14 + pfVar1[0x14] +
                                 fVar92 * fVar40 +
                                 fVar90 * fStack_1f8 +
                                 fVar114 * fStack_218 + fVar143 * fVar22 + fVar118 * fVar31;
                  pfVar1[0x15] = fVar137 * fVar89 + fVar141 * fStack_294 +
                                 fStack_234 * fVar91 + fVar97 * fVar15 + pfVar1[0x15] +
                                 fVar92 * fStack_2b4 +
                                 fVar90 * fStack_1f4 +
                                 fVar114 * fStack_214 + fVar143 * fVar23 + fVar118 * fVar32;
                  pfVar1[0x16] = fVar94 * fVar89 + fVar141 * fVar37 +
                                 fStack_230 * fVar91 + fVar97 * fVar16 + pfVar1[0x16] +
                                 fVar92 * fVar41 +
                                 fVar90 * fStack_1f0 +
                                 fVar114 * fStack_210 + fVar143 * fVar24 + fVar118 * fVar33;
                  pfVar1[0x17] = fVar101;
                  fVar101 = fStack_28c + fVar101;
                  fVar141 = fVar93 * fVar143 + fVar97 * fVar34 +
                            fVar118 * local_248 + fVar114 * fVar10 + pfVar1[0x18];
                  fVar89 = fVar95 * fVar143 + fVar97 * fStack_2a4 +
                           fVar118 * fStack_244 + fVar114 * fVar11 + pfVar1[0x19];
                  fVar91 = fVar96 * fVar143 + fVar97 * fVar35 +
                           fVar118 * fStack_240 + fVar114 * fVar12 + pfVar1[0x1a];
                  fVar93 = fVar119 * fVar143 + fVar97 * fStack_29c +
                           fVar118 * fStack_23c + fVar114 * fVar13 + pfVar1[0x1b];
                  fVar95 = fVar121 * fVar143 + fVar97 * fVar36 +
                           fVar118 * fStack_238 + fVar114 * fVar14 + pfVar1[0x1c];
                  fVar96 = fVar137 * fVar143 + fVar97 * fStack_294 +
                           fVar118 * fStack_234 + fVar114 * fVar15 + pfVar1[0x1d];
                  fVar114 = fVar94 * fVar143 + fVar97 * fVar37 +
                            fVar118 * fStack_230 + fVar114 * fVar16 + pfVar1[0x1e];
                  fVar97 = fVar101 + fVar97 + fStack_1ec + pfVar1[0x1f];
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar97,CONCAT424(fVar114,CONCAT420(fVar96,CONCAT416(
                                                  fVar95,CONCAT412(fVar93,CONCAT48(fVar91,CONCAT44(
                                                  fVar89,fVar141))))))));
                  auVar86._0_4_ =
                       fVar141 + fVar90 * local_328 + fVar92 * fVar27 + fVar139 * local_228 +
                                 fVar105 * local_208 + fVar112 * fVar38;
                  auVar86._4_4_ =
                       fVar89 + fVar90 * fVar19 + fVar92 * fVar28 + fVar139 * fStack_224 +
                                fVar105 * fStack_204 + fVar112 * fStack_2c4;
                  auVar86._8_4_ =
                       fVar91 + fVar90 * fStack_320 + fVar92 * fVar29 + fVar139 * fStack_220 +
                                fVar105 * fStack_200 + fVar112 * fVar39;
                  auVar86._12_4_ =
                       fVar93 + fVar90 * fVar21 + fVar92 * fVar30 + fVar139 * fStack_21c +
                                fVar105 * fStack_1fc + fVar112 * fStack_2bc;
                  auVar86._16_4_ =
                       fVar95 + fVar90 * fStack_318 + fVar92 * fVar31 + fVar139 * fStack_218 +
                                fVar105 * fStack_1f8 + fVar112 * fVar40;
                  auVar86._20_4_ =
                       fVar96 + fVar90 * fVar23 + fVar92 * fVar32 + fVar139 * fStack_214 +
                                fVar105 * fStack_1f4 + fVar112 * fStack_2b4;
                  auVar86._24_4_ =
                       fVar114 + fVar90 * fStack_310 + fVar92 * fVar33 + fVar139 * fStack_210 +
                                 fVar105 * fStack_1f0 + fVar112 * fVar41;
                  auVar86._28_4_ = fVar97 + fVar101 + fVar92 + fVar101 + fVar101 + fVar101;
                  *(undefined1 (*) [32])(pfVar1 + 0x18) = auVar86;
                  lVar82 = lVar82 + 0x10;
                  iVar76 = iVar76 + 4;
                  pauVar83 = (undefined1 (*) [32])(pfVar1 + 0x20);
                } while (iVar76 < (int)uVar6);
                pvVar70 = (void *)((long)pvVar70 + lVar82);
                pvVar81 = (void *)((long)pvVar81 + lVar82);
                pvVar75 = (void *)((long)pvVar75 + lVar82);
                auVar115 = ZEXT3264(auVar85);
                pauVar83 = pauVar77 + 4;
                fVar114 = local_268;
                fVar139 = fStack_264;
                fVar141 = fStack_260;
                fVar90 = fStack_25c;
                fVar105 = fStack_258;
                fVar89 = fStack_254;
                fVar92 = fStack_250;
                fVar104 = local_328;
                fVar125 = fStack_320;
                fVar109 = fStack_318;
                fVar110 = fStack_310;
                fVar112 = local_248;
                fVar91 = fStack_244;
                fVar97 = fStack_240;
                fVar143 = fStack_23c;
                fVar118 = fStack_238;
                fVar93 = fStack_234;
                fVar95 = fStack_230;
                fVar102 = local_2a8;
                fVar96 = fStack_2a4;
                fVar107 = fStack_2a0;
                fVar119 = fStack_29c;
                fVar120 = fStack_298;
                fVar121 = fStack_294;
                fVar106 = fStack_290;
                fVar136 = local_2c8;
                fVar137 = fStack_2c4;
                fVar138 = fStack_2c0;
                fVar94 = fStack_2bc;
                fVar108 = fStack_2b8;
                fVar101 = fStack_2b4;
                in_register_0000159c = fVar26;
                uVar66 = uVar6 & 0xfffffffc;
              }
              if ((int)(uVar66 | 1) < (int)uVar6) {
                lVar82 = 0;
                pauVar71 = pauVar83;
                uVar65 = uVar66;
                do {
                  pauVar77 = pauVar71;
                  fVar114 = *(float *)((long)pvVar70 + lVar82);
                  fVar139 = *(float *)((long)pvVar70 + lVar82 + 4);
                  fVar141 = *(float *)((long)pvVar70 + lVar82 + 8);
                  fVar90 = *(float *)((long)pvVar81 + lVar82);
                  fVar105 = *(float *)((long)pvVar81 + lVar82 + 4);
                  fVar89 = *(float *)((long)pvVar81 + lVar82 + 8);
                  fVar92 = *(float *)((long)pvVar75 + lVar82);
                  fVar112 = *(float *)((long)pvVar75 + lVar82 + 4);
                  fVar143 = in_register_0000159c + in_ZMM1._28_4_;
                  fVar91 = *(float *)((long)pvVar75 + lVar82 + 8);
                  pauVar71 = (undefined1 (*) [32])((long)pauVar83[2] + lVar82 * 2 * 4);
                  fVar94 = *(float *)((long)pauVar71[-2] + 4);
                  fVar101 = *(float *)((long)pauVar71[-2] + 8);
                  fVar104 = *(float *)((long)pauVar71[-2] + 0xc);
                  fVar125 = *(float *)((long)pauVar71[-2] + 0x10);
                  fVar109 = *(float *)((long)pauVar71[-2] + 0x14);
                  fVar110 = *(float *)((long)pauVar71[-2] + 0x18);
                  fVar118 = auVar115._0_4_;
                  fVar93 = auVar115._4_4_;
                  fVar95 = auVar115._8_4_;
                  fVar96 = auVar115._12_4_;
                  fVar119 = auVar115._16_4_;
                  fVar121 = auVar115._20_4_;
                  fVar137 = auVar115._24_4_;
                  in_register_0000159c = *(float *)((long)pvVar70 + lVar82 + 0xc);
                  fVar97 = *(float *)((long)pvVar81 + lVar82 + 0xc);
                  fVar102 = fVar92 + fVar92 + fVar143 + fVar114 + *(float *)((long)pauVar71[-2] +
                                                                            0x1c) +
                            fVar143 + fVar143 + fVar143 + fVar90;
                  fVar143 = *(float *)((long)pvVar75 + lVar82 + 0xc);
                  *(float *)pauVar71[-2] =
                       fVar91 * local_2c8 +
                       fVar92 * local_248 +
                       fVar105 * local_328 + fVar114 * local_2a8 + *(float *)pauVar71[-2] +
                       fVar112 * fVar27 +
                       fVar89 * fVar118 +
                       fVar141 * local_228 + fVar139 * fVar10 + fVar90 * local_268;
                  *(float *)((long)pauVar71[-2] + 4) =
                       fVar91 * fStack_2c4 +
                       fVar92 * fStack_244 + fVar105 * fVar19 + fVar114 * fStack_2a4 + fVar94 +
                       fVar112 * fVar28 +
                       fVar89 * fVar93 +
                       fVar141 * fStack_224 + fVar139 * fVar11 + fVar90 * fStack_264;
                  *(float *)((long)pauVar71[-2] + 8) =
                       fVar91 * fStack_2c0 +
                       fVar92 * fStack_240 + fVar105 * fStack_320 + fVar114 * fStack_2a0 + fVar101 +
                       fVar112 * fVar29 +
                       fVar89 * fVar95 +
                       fVar141 * fStack_220 + fVar139 * fVar12 + fVar90 * fStack_260;
                  *(float *)((long)pauVar71[-2] + 0xc) =
                       fVar91 * fStack_2bc +
                       fVar92 * fStack_23c + fVar105 * fVar21 + fVar114 * fStack_29c + fVar104 +
                       fVar112 * fVar30 +
                       fVar89 * fVar96 +
                       fVar141 * fStack_21c + fVar139 * fVar13 + fVar90 * fStack_25c;
                  *(float *)((long)pauVar71[-2] + 0x10) =
                       fVar91 * fStack_2b8 +
                       fVar92 * fStack_238 + fVar105 * fStack_318 + fVar114 * fStack_298 + fVar125 +
                       fVar112 * fVar31 +
                       fVar89 * fVar119 +
                       fVar141 * fStack_218 + fVar139 * fVar14 + fVar90 * fStack_258;
                  *(float *)((long)pauVar71[-2] + 0x14) =
                       fVar91 * fStack_2b4 +
                       fVar92 * fStack_234 + fVar105 * fVar23 + fVar114 * fStack_294 + fVar109 +
                       fVar112 * fVar32 +
                       fVar89 * fVar121 +
                       fVar141 * fStack_214 + fVar139 * fVar15 + fVar90 * fStack_254;
                  *(float *)((long)pauVar71[-2] + 0x18) =
                       fVar91 * fVar41 +
                       fVar92 * fStack_230 + fVar105 * fStack_310 + fVar114 * fStack_290 + fVar110 +
                       fVar112 * fVar33 +
                       fVar89 * fVar137 +
                       fVar141 * fStack_210 + fVar139 * fVar16 + fVar90 * fStack_250;
                  *(float *)((long)pauVar71[-2] + 0x1c) = fVar102;
                  auVar115 = ZEXT3264(auVar115._0_32_);
                  fVar125 = fVar105 + fVar139 + fVar139 + fVar102;
                  fVar114 = fVar105 * local_268 + fVar89 * local_328 +
                            fVar141 * fVar10 + fVar139 * local_2a8 + *(float *)pauVar71[-1];
                  fVar90 = fVar105 * fStack_264 + fVar89 * fVar19 +
                           fVar141 * fVar11 + fVar139 * fStack_2a4 +
                           *(float *)((long)pauVar71[-1] + 4);
                  fVar92 = fVar105 * fStack_260 + fVar89 * fStack_320 +
                           fVar141 * fVar12 + fVar139 * fStack_2a0 +
                           *(float *)((long)pauVar71[-1] + 8);
                  fVar94 = fVar105 * fStack_25c + fVar89 * fVar21 +
                           fVar141 * fVar13 + fVar139 * fStack_29c +
                           *(float *)((long)pauVar71[-1] + 0xc);
                  fVar101 = fVar105 * fStack_258 + fVar89 * fStack_318 +
                            fVar141 * fVar14 + fVar139 * fStack_298 +
                            *(float *)((long)pauVar71[-1] + 0x10);
                  fVar104 = fVar105 * fStack_254 + fVar89 * fVar23 +
                            fVar141 * fVar15 + fVar139 * fStack_294 +
                            *(float *)((long)pauVar71[-1] + 0x14);
                  fVar139 = fVar105 * fStack_250 + fVar89 * fStack_310 +
                            fVar141 * fVar16 + fVar139 * fStack_290 +
                            *(float *)((long)pauVar71[-1] + 0x18);
                  fVar141 = fVar125 + *(float *)((long)pauVar71[-1] + 0x1c);
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar139,CONCAT420(fVar104,CONCAT416
                                                  (fVar101,CONCAT412(fVar94,CONCAT48(fVar92,CONCAT44
                                                  (fVar90,fVar114))))))));
                  auVar87._0_4_ =
                       fVar114 + fVar112 * local_248 + fVar27 * fVar91 +
                                 in_register_0000159c * local_228 + fVar97 * fVar118 +
                                 local_2c8 * fVar143;
                  auVar87._4_4_ =
                       fVar90 + fVar112 * fStack_244 + fVar28 * fVar91 +
                                in_register_0000159c * fStack_224 + fVar97 * fVar93 +
                                fStack_2c4 * fVar143;
                  auVar87._8_4_ =
                       fVar92 + fVar112 * fStack_240 + fVar29 * fVar91 +
                                in_register_0000159c * fStack_220 + fVar97 * fVar95 +
                                fStack_2c0 * fVar143;
                  auVar87._12_4_ =
                       fVar94 + fVar112 * fStack_23c + fVar30 * fVar91 +
                                in_register_0000159c * fStack_21c + fVar97 * fVar96 +
                                fStack_2bc * fVar143;
                  auVar87._16_4_ =
                       fVar101 + fVar112 * fStack_238 + fVar31 * fVar91 +
                                 in_register_0000159c * fStack_218 + fVar97 * fVar119 +
                                 fStack_2b8 * fVar143;
                  auVar87._20_4_ =
                       fVar104 + fVar112 * fStack_234 + fVar32 * fVar91 +
                                 in_register_0000159c * fStack_214 + fVar97 * fVar121 +
                                 fStack_2b4 * fVar143;
                  auVar87._24_4_ =
                       fVar139 + fVar112 * fStack_230 + fVar33 * fVar91 +
                                 in_register_0000159c * fStack_210 + fVar97 * fVar137 +
                                 fVar41 * fVar143;
                  auVar87._28_4_ = fVar141 + fStack_28c + fVar9 + fVar9 + fVar9 + fVar125;
                  pauVar71[-1] = auVar87;
                  uVar66 = uVar65 + 2;
                  lVar82 = lVar82 + 8;
                  iVar76 = uVar65 + 3;
                  uVar65 = uVar66;
                } while (iVar76 < (int)uVar6);
                pauVar83 = pauVar77 + 2;
                pvVar70 = (void *)((long)pvVar70 + lVar82);
                pvVar81 = (void *)((long)pvVar81 + lVar82);
                pvVar75 = (void *)((long)pvVar75 + lVar82);
                fVar114 = local_268;
                fVar139 = fStack_264;
                fVar141 = fStack_260;
                fVar90 = fStack_25c;
                fVar105 = fStack_258;
                fVar89 = fStack_254;
                fVar92 = fStack_250;
                fVar104 = local_328;
                fVar125 = fStack_320;
                fVar109 = fStack_318;
                fVar110 = fStack_310;
                fVar112 = local_248;
                fVar91 = fStack_244;
                fVar97 = fStack_240;
                fVar143 = fStack_23c;
                fVar118 = fStack_238;
                fVar93 = fStack_234;
                fVar95 = fStack_230;
                fVar102 = local_2a8;
                fVar96 = fStack_2a4;
                fVar107 = fStack_2a0;
                fVar119 = fStack_29c;
                fVar120 = fStack_298;
                fVar121 = fStack_294;
                fVar106 = fStack_290;
                fVar136 = local_2c8;
                fVar137 = fStack_2c4;
                fVar138 = fStack_2c0;
                fVar94 = fStack_2bc;
                fVar108 = fStack_2b8;
                fVar101 = fStack_2b4;
              }
              iVar76 = uVar6 - uVar66;
              pauVar71 = pauVar83;
              if (iVar76 != 0 && (int)uVar66 <= (int)uVar6) {
                lVar82 = 0;
                do {
                  fVar126 = *(float *)((long)pvVar70 + lVar82);
                  fVar130 = *(float *)((long)pvVar70 + lVar82 + 4);
                  fVar131 = *(float *)((long)pvVar70 + lVar82 + 8);
                  fVar132 = *(float *)((long)pvVar81 + lVar82);
                  fVar116 = *(float *)((long)pvVar81 + lVar82 + 4);
                  fVar111 = *(float *)((long)pvVar81 + lVar82 + 8);
                  pfVar1 = (float *)((long)*pauVar83 + lVar82 * 2 * 4);
                  fVar113 = *(float *)((long)pvVar75 + lVar82);
                  fVar122 = *(float *)((long)pvVar75 + lVar82 + 4);
                  fVar133 = *(float *)((long)pvVar75 + lVar82 + 8);
                  fVar134 = fVar130 * fVar10 + local_228 * fVar131 + fVar132 * fVar114 +
                            auVar115._0_4_ * fVar111 + fVar27 * fVar122;
                  fVar142 = fVar130 * fVar11 + fStack_224 * fVar131 + fVar132 * fVar139 +
                            auVar115._4_4_ * fVar111 + fVar28 * fVar122;
                  fVar140 = fVar130 * fVar12 + fStack_220 * fVar131 + fVar132 * fVar141 +
                            auVar115._8_4_ * fVar111 + fVar29 * fVar122;
                  fVar123 = fVar130 * fVar13 + fStack_21c * fVar131 + fVar132 * fVar90 +
                            auVar115._12_4_ * fVar111 + fVar30 * fVar122;
                  fVar117 = fVar130 * fVar14 + fStack_218 * fVar131 + fVar132 * fVar105 +
                            auVar115._16_4_ * fVar111 + fVar31 * fVar122;
                  fVar124 = fVar130 * fVar15 + fStack_214 * fVar131 + fVar132 * fVar89 +
                            auVar115._20_4_ * fVar111 + fVar32 * fVar122;
                  fVar135 = fVar130 * fVar16 + fStack_210 * fVar131 + fVar132 * fVar92 +
                            auVar115._24_4_ * fVar111 + fVar33 * fVar122;
                  fVar122 = fVar130 + fVar131 + fVar132 + fVar111 + fVar122;
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar122,CONCAT424(fVar135,CONCAT420(fVar124,CONCAT416
                                                  (fVar117,CONCAT412(fVar123,CONCAT48(fVar140,
                                                  CONCAT44(fVar142,fVar134))))))));
                  auVar88._0_4_ =
                       fVar102 * fVar126 + *pfVar1 + fVar116 * fVar104 + fVar113 * fVar112 +
                       fVar136 * fVar133 + fVar134;
                  auVar88._4_4_ =
                       fVar96 * fVar126 + pfVar1[1] + fVar116 * fVar19 + fVar113 * fVar91 +
                       fVar137 * fVar133 + fVar142;
                  auVar88._8_4_ =
                       fVar107 * fVar126 + pfVar1[2] + fVar116 * fVar125 + fVar113 * fVar97 +
                       fVar138 * fVar133 + fVar140;
                  auVar88._12_4_ =
                       fVar119 * fVar126 + pfVar1[3] + fVar116 * fVar21 + fVar113 * fVar143 +
                       fVar94 * fVar133 + fVar123;
                  auVar88._16_4_ =
                       fVar120 * fVar126 + pfVar1[4] + fVar116 * fVar109 + fVar113 * fVar118 +
                       fVar108 * fVar133 + fVar117;
                  auVar88._20_4_ =
                       fVar121 * fVar126 + pfVar1[5] + fVar116 * fVar23 + fVar113 * fVar93 +
                       fVar101 * fVar133 + fVar124;
                  auVar88._24_4_ =
                       fVar106 * fVar126 + pfVar1[6] + fVar116 * fVar110 + fVar113 * fVar95 +
                       fVar41 * fVar133 + fVar135;
                  auVar88._28_4_ = fVar126 + pfVar1[7] + fVar116 + fVar113 + fVar133 + fVar122;
                  *(undefined1 (*) [32])((long)*pauVar83 + lVar82 * 2 * 4) = auVar88;
                  pauVar71 = pauVar71 + 1;
                  lVar82 = lVar82 + 4;
                  iVar76 = iVar76 + -1;
                } while (iVar76 != 0);
                pvVar70 = (void *)((long)pvVar70 + lVar82);
                pvVar81 = (void *)((long)pvVar81 + lVar82);
                pvVar75 = (void *)((long)pvVar75 + lVar82);
              }
              pvVar70 = (void *)((long)pvVar70 + 8);
              pvVar81 = (void *)((long)pvVar81 + 8);
              pvVar75 = (void *)((long)pvVar75 + 8);
              iVar64 = iVar64 + 1;
            } while (iVar64 != iVar7);
          }
          pfVar79 = pfVar79 + 0x48;
          uVar73 = uVar73 + 1;
        } while (uVar73 != uVar5);
      }
      uVar74 = uVar74 + 1;
    } while ((long)uVar74 < (long)iVar8);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        __m256 _bias1 = bias ? _mm256_loadu_ps((const float*)bias + (p + 1) * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00_0 = _mm256_loadu_ps(k0);
            __m256 _k01_0 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02_0 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10_0 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11_0 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12_0 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20_0 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21_0 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22_0 = _mm256_loadu_ps(k0 + 64);

            __m256 _k00_1 = _mm256_loadu_ps(k1);
            __m256 _k01_1 = _mm256_loadu_ps(k1 + 8);
            __m256 _k02_1 = _mm256_loadu_ps(k1 + 16);
            __m256 _k10_1 = _mm256_loadu_ps(k1 + 24);
            __m256 _k11_1 = _mm256_loadu_ps(k1 + 32);
            __m256 _k12_1 = _mm256_loadu_ps(k1 + 40);
            __m256 _k20_1 = _mm256_loadu_ps(k1 + 48);
            __m256 _k21_1 = _mm256_loadu_ps(k1 + 56);
            __m256 _k22_1 = _mm256_loadu_ps(k1 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    __m256 _sum02 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _sum12 = _mm256_loadu_ps(outptr1 + 16);

                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);

                    _sum02 = _mm256_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm256_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm256_storeu_ps(outptr0 + 16, _sum02);
                    _mm256_storeu_ps(outptr1 + 16, _sum12);

                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);

                    __m256 _sum03 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _sum13 = _mm256_loadu_ps(outptr1 + 24);

                    _sum03 = _mm256_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm256_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm256_storeu_ps(outptr0 + 24, _sum03);
                    _mm256_storeu_ps(outptr1 + 24, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                    outptr1 += 32;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
            k1 += 9 * 8;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m256 _sum2 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    _sum2 = _mm256_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m256 _sum3 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);
                    _mm256_storeu_ps(outptr0 + 16, _sum2);

                    _sum3 = _mm256_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm256_storeu_ps(outptr0 + 24, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                }
                for (; j < outw; j++)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm256_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
        }
    }
}